

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# is_distinct_from.cpp
# Opt level: O1

idx_t duckdb::TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                (Vector *left,Vector *right,optional_ptr<const_duckdb::SelectionVector,_true> sel,
                idx_t count,optional_ptr<duckdb::SelectionVector,_true> true_sel,
                optional_ptr<duckdb::SelectionVector,_true> false_sel,
                optional_ptr<duckdb::ValidityMask,_true> null_mask)

{
  SelectionVector *pSVar1;
  PhysicalType PVar2;
  VectorType VVar3;
  VectorType VVar4;
  unsigned_long *puVar5;
  uint *puVar6;
  short *psVar7;
  ushort *puVar8;
  byte *pbVar9;
  ulong *puVar10;
  data_ptr_t pdVar11;
  _Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_> _Var12;
  data_ptr_t pdVar13;
  unsigned_long *puVar14;
  byte bVar15;
  undefined1 auVar16 [16];
  undefined8 uVar17;
  element_type *peVar18;
  undefined1 auVar19 [8];
  undefined8 uVar20;
  ulong uVar21;
  Vector *pVVar22;
  idx_t iVar23;
  element_type *peVar24;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true> *this;
  vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
  *this_00;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var25;
  TemplatedValidityData<unsigned_long> *pTVar26;
  reference pvVar27;
  type pVVar28;
  idx_t iVar29;
  NotImplementedException *this_01;
  InternalException *this_02;
  ulong uVar30;
  optional_ptr<duckdb::SelectionVector,_true> oVar31;
  ulong uVar32;
  optional_ptr<duckdb::ValidityMask,_true> oVar33;
  sel_t *psVar34;
  idx_t iVar35;
  idx_t iVar36;
  idx_t idx_in_entry;
  long *plVar37;
  ulong *puVar38;
  float *pfVar39;
  double *pdVar40;
  string_t *psVar41;
  uhugeint_t *puVar42;
  int iVar43;
  idx_t pos;
  int *piVar44;
  sel_t sVar45;
  undefined4 uVar46;
  size_type __n;
  UnifiedVectorFormat *slice_sel_00;
  optional_ptr<const_duckdb::SelectionVector,_true> oVar47;
  long lVar48;
  ulong uVar49;
  long lVar50;
  long lVar51;
  sel_t *psVar52;
  interval_t *input;
  ulong uVar53;
  long lVar54;
  int *piVar55;
  int iVar56;
  idx_t pos_1;
  sel_t *psVar57;
  sel_t *psVar58;
  sel_t *psVar59;
  ulong uVar60;
  float *pfVar61;
  double *pdVar62;
  string_t *psVar63;
  uhugeint_t *puVar64;
  long lVar65;
  long lVar66;
  bool bVar67;
  bool bVar68;
  undefined1 auVar69 [16];
  undefined1 auVar70 [16];
  undefined1 auVar71 [16];
  undefined1 auVar72 [16];
  undefined1 auVar73 [16];
  undefined1 auVar74 [16];
  interval_t *input_1;
  UnifiedVectorFormat lvdata;
  UnifiedVectorFormat rvdata;
  SelectionVector slice_sel;
  SelectionVector lcursor;
  SelectionVector rcursor;
  ValidityMask child_validity;
  SelectionVector maybe_vec;
  Vector rchild;
  SelectionVector false_sel_1;
  SelectionVector true_sel_1;
  Vector lchild;
  UnifiedVectorFormat rvdata_1;
  OptionalSelection false_opt;
  OptionalSelection true_opt;
  UnifiedVectorFormat lvdata_1;
  SelectionVector false_vec;
  SelectionVector true_vec;
  Vector l_not_null;
  Vector r_not_null;
  optional_ptr<duckdb::ValidityMask,_true> local_4d8;
  sel_t *local_4d0;
  ulong local_4c0;
  sel_t *local_4b8;
  long local_4b0;
  undefined1 local_4a8 [8];
  LogicalType LStack_4a0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_488;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_470;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_468;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_458;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_448;
  undefined1 local_438 [8];
  LogicalType LStack_430;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_418;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_400;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3f8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3e8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_3d8;
  sel_t *local_3c8;
  optional_ptr<duckdb::ValidityMask,_true> local_3c0;
  SelectionVector local_3b8;
  SelectionVector local_3a0;
  sel_t *local_388;
  SelectionVector local_380;
  undefined1 local_368 [56];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_330;
  undefined1 local_328 [8];
  LogicalType aLStack_320 [2];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2f0;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2d8;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_2c8;
  SelectionVector local_2b8;
  SelectionVector local_2a0;
  Vector local_288;
  optional_ptr<duckdb::SelectionVector,_true> local_218;
  optional_ptr<duckdb::SelectionVector,_true> local_210;
  optional_ptr<const_duckdb::SelectionVector,_true> local_208;
  UnifiedVectorFormat local_200;
  OptionalSelection local_1b8;
  OptionalSelection local_198;
  UnifiedVectorFormat local_178;
  SelectionVector local_130;
  SelectionVector local_118;
  Vector local_100;
  Vector local_98;
  
  PVar2 = (left->type).physical_type_;
  if (199 < PVar2) {
    if (PVar2 == VARCHAR) {
      local_328 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (local_328 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar67 = false;
        }
        else {
          bVar67 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar5 & 1) == 0;
        }
        if ((bVar67 | bVar68) == 1) {
          bVar68 = (bool)(bVar68 ^ 1);
        }
        else {
          bVar68 = string_t::StringComparisonOperators::GreaterThan
                             ((string_t *)left->data,(string_t *)right->data);
        }
        if (bVar68 == false) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(sel_t *)0x0;
          }
          psVar58 = (sel.ptr)->sel_vector;
          psVar34 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          do {
            sVar45 = (sel_t)iVar35;
            if (psVar58 != (sel_t *)0x0) {
              sVar45 = psVar58[iVar35];
            }
            psVar34[iVar35] = sVar45;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          return (idx_t)(sel_t *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          psVar34 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          do {
            sVar45 = (sel_t)iVar35;
            if (psVar58 != (sel_t *)0x0) {
              sVar45 = psVar58[iVar35];
            }
            psVar34[iVar35] = sVar45;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        psVar41 = (string_t *)left->data;
        psVar63 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013ced10;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              psVar63 = psVar63 + 1;
            } while (count != uVar49);
            goto LAB_013d109a;
          }
          if (count != 0) {
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              psVar63 = psVar63 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar49);
            goto LAB_013d10a4;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            psVar63 = psVar63 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            psVar41 = (string_t *)left->data;
            psVar63 = (string_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              lVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                psVar41 = psVar41 + 1;
                psVar63 = psVar63 + 1;
              } while (count != uVar49);
              return (idx_t)local_4d0;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              uVar49 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar49 = uVar49 + 1;
                psVar41 = psVar41 + 1;
                psVar63 = psVar63 + 1;
              } while (count != uVar49);
              return (idx_t)local_4d0;
            }
            if (count != 0) {
              lVar48 = 0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
                }
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                psVar41 = psVar41 + 1;
                psVar63 = psVar63 + 1;
              } while (count != uVar49);
              goto LAB_013d42e2;
            }
            goto LAB_013d2e1e;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
          uVar17 = LStack_4a0._0_8_;
          uVar20 = LStack_430._0_8_;
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_013d40d0;
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                lVar50 = 0;
                iVar35 = 0;
                do {
                  iVar23 = iVar35;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar35];
                  }
                  iVar29 = iVar35;
                  if (lVar48 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                  }
                  iVar36 = iVar35;
                  if (psVar34 != (sel_t *)0x0) {
                    iVar36 = (idx_t)psVar34[iVar35];
                  }
                  bVar67 = string_t::StringComparisonOperators::GreaterThan
                                     ((string_t *)(uVar17 + iVar29 * 0x10),
                                      (string_t *)(uVar20 + iVar36 * 0x10));
                  if (!bVar67) {
                    (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                    lVar50 = lVar50 + 1;
                  }
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
                goto LAB_013d40d2;
              }
              if (count == 0) goto LAB_013d2375;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              iVar35 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                bVar67 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar36 * 0x10));
                if (bVar67) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
            else {
              if (count == 0) goto LAB_013d2375;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              local_4d0 = (sel_t *)0x0;
              iVar35 = 0;
              psVar59 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                bVar67 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar36 * 0x10));
                if (bVar67) {
                  psVar57 = local_4d0;
                  oVar31.ptr = true_sel.ptr;
                  psVar52 = psVar59;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                else {
                  psVar52 = (sel_t *)((long)psVar59 + 1);
                  psVar57 = psVar59;
                  oVar31.ptr = false_sel.ptr;
                }
                (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
                iVar35 = iVar35 + 1;
                psVar59 = psVar52;
              } while (count != iVar35);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d40d0;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f)
                           & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = string_t::StringComparisonOperators::GreaterThan
                                     ((string_t *)(uVar17 + iVar29 * 0x10),
                                      (string_t *)(uVar20 + iVar36 * 0x10));
                }
                if (bVar68 == false) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d40d2;
            }
            if (count == 0) goto LAB_013d2375;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            iVar35 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar36 * 0x10));
              }
              if (bVar68 != false) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2375;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan
                                   ((string_t *)(uVar17 + iVar29 * 0x10),
                                    (string_t *)(uVar20 + iVar36 * 0x10));
              }
              if (bVar68 == false) {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar31.ptr = false_sel.ptr;
              }
              else {
                psVar57 = local_4d0;
                oVar31.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar52;
            } while (count != iVar35);
          }
          goto LAB_013d40df;
        }
        psVar41 = (string_t *)left->data;
        psVar63 = (string_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d108f;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              psVar41 = psVar41 + 1;
            } while (count != uVar49);
            goto LAB_013d109a;
          }
          if (count != 0) {
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              psVar41 = psVar41 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar49);
            goto LAB_013d10a4;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = string_t::StringComparisonOperators::GreaterThan(psVar41,psVar63);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            psVar41 = psVar41 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
    }
    else {
      if (PVar2 != UINT128) {
        if (PVar2 != INT128) goto switchD_013c4dc2_caseD_a;
        local_328 = (undefined1  [8])null_mask.ptr;
        if (sel.ptr == (SelectionVector *)0x0) {
          sel.ptr = FlatVector::IncrementalSelectionVector();
        }
        if (local_328 != (undefined1  [8])0x0) {
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
          UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
          optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                    ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
          UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
        }
        VVar3 = left->vector_type;
        VVar4 = right->vector_type;
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*puVar5 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = false;
          }
          else {
            bVar68 = (*puVar5 & 1) == 0;
          }
          if ((bool)(bVar67 | bVar68)) {
            bVar68 = (bool)(bVar68 ^ 1);
          }
          else {
            uVar49 = *(ulong *)((long)left->data + 8);
            uVar32 = *(ulong *)((long)right->data + 8);
            bVar68 = *(ulong *)right->data < *(ulong *)left->data && uVar49 == uVar32 ||
                     uVar49 != uVar32 && (long)uVar32 <= (long)uVar49;
          }
          if (!bVar68) {
            if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            psVar34 = (false_sel.ptr)->sel_vector;
            iVar35 = 0;
            do {
              sVar45 = (sel_t)iVar35;
              if (psVar58 != (sel_t *)0x0) {
                sVar45 = psVar58[iVar35];
              }
              psVar34[iVar35] = sVar45;
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            return (idx_t)(sel_t *)0x0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            psVar34 = (true_sel.ptr)->sel_vector;
            iVar35 = 0;
            do {
              sVar45 = (sel_t)iVar35;
              if (psVar58 != (sel_t *)0x0) {
                sVar45 = psVar58[iVar35];
              }
              psVar34[iVar35] = sVar45;
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            return count;
          }
          return count;
        }
        if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          puVar10 = (ulong *)left->data;
          pdVar11 = right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
            local_288._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_438,(unsigned_long *)&local_288);
            peVar18 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_438;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_430._0_8_;
            _local_438 = (undefined1  [16])0x0;
            LStack_4a0._0_8_ = auVar19;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
            pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (pTVar26->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            local_4a8 = (undefined1  [8])
                        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(right);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d116c;
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar34 = (false_sel.ptr)->sel_vector;
              puVar38 = (ulong *)(pdVar11 + 8);
              lVar48 = 0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if (psVar58 != (sel_t *)0x0) {
                  uVar32 = (ulong)psVar58[uVar49];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  uVar60 = puVar10[1];
                  uVar30 = *puVar38;
                  bVar68 = puVar38[-1] < *puVar10 && uVar60 == uVar30 ||
                           uVar60 != uVar30 && (long)uVar30 <= (long)uVar60;
                }
                psVar34[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                puVar38 = puVar38 + 2;
              } while (count != uVar49);
              goto LAB_013d116e;
            }
            if (count != 0) {
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar34 = (true_sel.ptr)->sel_vector;
              puVar38 = (ulong *)(pdVar11 + 8);
              uVar49 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar32 = uVar49;
                if (psVar58 != (sel_t *)0x0) {
                  uVar32 = (ulong)psVar58[uVar49];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(byte *)local_4a8 & 1) == 0;
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  uVar60 = puVar10[1];
                  uVar30 = *puVar38;
                  bVar68 = puVar38[-1] < *puVar10 && uVar60 == uVar30 ||
                           uVar60 != uVar30 && (long)uVar30 <= (long)uVar60;
                }
                psVar34[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar49 = uVar49 + 1;
                puVar38 = puVar38 + 2;
              } while (count != uVar49);
              goto LAB_013d117e;
            }
          }
          else if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            puVar38 = (ulong *)(pdVar11 + 8);
            lVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                uVar60 = puVar10[1];
                uVar30 = *puVar38;
                bVar68 = puVar38[-1] < *puVar10 && uVar60 == uVar30 ||
                         uVar60 != uVar30 && (long)uVar30 <= (long)uVar60;
              }
              psVar34[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              puVar38 = puVar38 + 2;
            } while (count != uVar49);
            goto LAB_013d117e;
          }
        }
        else {
          if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
            if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
              pdVar11 = left->data;
              pdVar13 = right->data;
              FlatVector::VerifyFlatVector(left);
              FlatVector::VerifyFlatVector(right);
              if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0)
              {
                if (count == 0) {
                  return (idx_t)(sel_t *)0x0;
                }
                psVar34 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar59 = (true_sel.ptr)->sel_vector;
                psVar57 = (false_sel.ptr)->sel_vector;
                lVar48 = 8;
                lVar50 = 0;
                psVar58 = (sel_t *)0x0;
                uVar49 = 0;
                do {
                  uVar32 = uVar49;
                  if (psVar34 != (sel_t *)0x0) {
                    uVar32 = (ulong)psVar34[uVar49];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar67 = false;
                  }
                  else {
                    bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                  }
                  if (!bVar67 && bVar68 == true) {
                    lVar51 = *(long *)(pdVar11 + lVar48);
                    lVar54 = *(long *)(pdVar13 + lVar48);
                    bVar68 = *(ulong *)(pdVar13 + lVar48 + -8) < *(ulong *)(pdVar11 + lVar48 + -8)
                             && lVar51 == lVar54 || lVar51 != lVar54 && lVar54 <= lVar51;
                  }
                  psVar59[(long)psVar58] = (sel_t)uVar32;
                  psVar58 = (sel_t *)((ulong)bVar68 + (long)psVar58);
                  psVar57[lVar50] = (sel_t)uVar32;
                  lVar50 = lVar50 + (ulong)(bVar68 ^ 1);
                  uVar49 = uVar49 + 1;
                  lVar48 = lVar48 + 0x10;
                } while (count != uVar49);
                return (idx_t)psVar58;
              }
              if (true_sel.ptr != (SelectionVector *)0x0) {
                if (count == 0) {
                  return (idx_t)(sel_t *)0x0;
                }
                psVar58 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar34 = (true_sel.ptr)->sel_vector;
                lVar48 = 8;
                uVar49 = 0;
                psVar59 = (sel_t *)0x0;
                do {
                  uVar32 = uVar49;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar32 = (ulong)psVar58[uVar49];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar67 = false;
                  }
                  else {
                    bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                  }
                  if (!bVar67 && bVar68 == true) {
                    lVar50 = *(long *)(pdVar11 + lVar48);
                    lVar51 = *(long *)(pdVar13 + lVar48);
                    bVar68 = *(ulong *)(pdVar13 + lVar48 + -8) < *(ulong *)(pdVar11 + lVar48 + -8)
                             && lVar50 == lVar51 || lVar50 != lVar51 && lVar51 <= lVar50;
                  }
                  psVar34[(long)psVar59] = (sel_t)uVar32;
                  psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
                  uVar49 = uVar49 + 1;
                  lVar48 = lVar48 + 0x10;
                } while (count != uVar49);
                return (idx_t)psVar59;
              }
              if (count != 0) {
                psVar58 = (sel.ptr)->sel_vector;
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask
                ;
                psVar34 = (false_sel.ptr)->sel_vector;
                lVar50 = 8;
                lVar48 = 0;
                uVar49 = 0;
                do {
                  uVar32 = uVar49;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar32 = (ulong)psVar58[uVar49];
                  }
                  if (puVar5 == (unsigned_long *)0x0) {
                    bVar67 = false;
                  }
                  else {
                    bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                  }
                  if (puVar14 == (unsigned_long *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                  }
                  if (!bVar67 && bVar68 == true) {
                    lVar51 = *(long *)(pdVar11 + lVar50);
                    lVar54 = *(long *)(pdVar13 + lVar50);
                    bVar68 = *(ulong *)(pdVar13 + lVar50 + -8) < *(ulong *)(pdVar11 + lVar50 + -8)
                             && lVar51 == lVar54 || lVar51 != lVar54 && lVar54 <= lVar51;
                  }
                  psVar34[lVar48] = (sel_t)uVar32;
                  lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                  uVar49 = uVar49 + 1;
                  lVar50 = lVar50 + 0x10;
                } while (count != uVar49);
                goto LAB_013d2ef9;
              }
              goto LAB_013d2ef7;
            }
            UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
            UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
            Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
            Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0 &&
                LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
              {
                if (true_sel.ptr == (SelectionVector *)0x0) {
                  if (count == 0) goto LAB_013d41ab;
                  psVar58 = (sel.ptr)->sel_vector;
                  lVar48 = *(long *)local_4a8;
                  psVar34 = *(sel_t **)local_438;
                  lVar50 = 0;
                  iVar35 = 0;
                  do {
                    iVar23 = iVar35;
                    if (psVar58 != (sel_t *)0x0) {
                      iVar23 = (idx_t)psVar58[iVar35];
                    }
                    iVar29 = iVar35;
                    if (lVar48 != 0) {
                      iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                    }
                    iVar36 = iVar35;
                    if (psVar34 != (sel_t *)0x0) {
                      iVar36 = (idx_t)psVar34[iVar35];
                    }
                    if ((*(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) <=
                         *(long *)(LStack_430._0_8_ + iVar36 * 0x10 + 8)) &&
                       (*(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) <=
                        *(ulong *)(LStack_430._0_8_ + iVar36 * 0x10) ||
                        *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) !=
                        *(long *)(LStack_430._0_8_ + iVar36 * 0x10 + 8))) {
                      (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                      lVar50 = lVar50 + 1;
                    }
                    iVar35 = iVar35 + 1;
                  } while (count != iVar35);
                  goto LAB_013d4295;
                }
                if (count == 0) goto LAB_013d2509;
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                iVar35 = 0;
                local_4d0 = (sel_t *)0x0;
                do {
                  iVar23 = iVar35;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar35];
                  }
                  iVar29 = iVar35;
                  if (lVar48 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                  }
                  iVar36 = iVar35;
                  if (psVar34 != (sel_t *)0x0) {
                    iVar36 = (idx_t)psVar34[iVar35];
                  }
                  if ((*(long *)(LStack_430._0_8_ + iVar36 * 0x10 + 8) <
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8)) ||
                     (*(ulong *)(LStack_430._0_8_ + iVar36 * 0x10) <
                      *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) &&
                      *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) ==
                      *(long *)(LStack_430._0_8_ + iVar36 * 0x10 + 8))) {
                    (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                    local_4d0 = (sel_t *)((long)local_4d0 + 1);
                  }
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
              }
              else {
                if (count == 0) goto LAB_013d2509;
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                iVar35 = 0;
                psVar59 = (sel_t *)0x0;
                psVar57 = (sel_t *)0x0;
                do {
                  iVar23 = iVar35;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar35];
                  }
                  iVar29 = iVar35;
                  if (lVar48 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                  }
                  iVar36 = iVar35;
                  if (psVar34 != (sel_t *)0x0) {
                    iVar36 = (idx_t)psVar34[iVar35];
                  }
                  if ((*(long *)(LStack_430._0_8_ + iVar36 * 0x10 + 8) <
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8)) ||
                     (*(ulong *)(LStack_430._0_8_ + iVar36 * 0x10) <
                      *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) &&
                      *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) ==
                      *(long *)(LStack_430._0_8_ + iVar36 * 0x10 + 8))) {
                    local_4d0 = (sel_t *)((long)psVar57 + 1);
                    oVar31.ptr = true_sel.ptr;
                    psVar52 = psVar59;
                    psVar59 = psVar57;
                  }
                  else {
                    oVar31.ptr = false_sel.ptr;
                    psVar52 = (sel_t *)((long)psVar59 + 1);
                    local_4d0 = psVar57;
                  }
                  (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
                  iVar35 = iVar35 + 1;
                  psVar59 = psVar52;
                  psVar57 = local_4d0;
                } while (count != iVar35);
              }
            }
            else if (false_sel.ptr == (SelectionVector *)0x0 ||
                     true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_013d4290;
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                lVar50 = 0;
                iVar35 = 0;
                do {
                  iVar23 = iVar35;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar35];
                  }
                  iVar29 = iVar35;
                  if (lVar48 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                  }
                  iVar36 = iVar35;
                  if (psVar34 != (sel_t *)0x0) {
                    iVar36 = (idx_t)psVar34[iVar35];
                  }
                  if (LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar67 = false;
                  }
                  else {
                    bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                               ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1)
                             == 0;
                  }
                  if (LStack_430.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr
                      == (element_type *)0x0) {
                    bVar68 = true;
                  }
                  else {
                    bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >>
                              (iVar36 & 0x3f) & 1) != 0;
                  }
                  if (!bVar67 && bVar68) {
                    uVar49 = ((ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10))[1];
                    uVar32 = ((ulong *)(LStack_430._0_8_ + iVar36 * 0x10))[1];
                    bVar68 = *(ulong *)(LStack_430._0_8_ + iVar36 * 0x10) <
                             *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) && uVar49 == uVar32 ||
                             uVar49 != uVar32 && (long)uVar32 <= (long)uVar49;
                  }
                  if (!bVar68) {
                    (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                    lVar50 = lVar50 + 1;
                  }
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
                goto LAB_013d4295;
              }
              if (count == 0) goto LAB_013d2509;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              iVar35 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f)
                           & 1) != 0;
                }
                if (!bVar67 && bVar68) {
                  uVar49 = ((ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10))[1];
                  uVar32 = ((ulong *)(LStack_430._0_8_ + iVar36 * 0x10))[1];
                  bVar68 = *(ulong *)(LStack_430._0_8_ + iVar36 * 0x10) <
                           *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) && uVar49 == uVar32 ||
                           uVar49 != uVar32 && (long)uVar32 <= (long)uVar49;
                }
                if (bVar68) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
            else {
              if (count == 0) goto LAB_013d2509;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              iVar35 = 0;
              psVar59 = (sel_t *)0x0;
              psVar57 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f)
                           & 1) != 0;
                }
                if (!bVar67 && bVar68) {
                  uVar49 = ((ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10))[1];
                  uVar32 = ((ulong *)(LStack_430._0_8_ + iVar36 * 0x10))[1];
                  bVar68 = *(ulong *)(LStack_430._0_8_ + iVar36 * 0x10) <
                           *(ulong *)(LStack_4a0._0_8_ + iVar29 * 0x10) && uVar49 == uVar32 ||
                           uVar49 != uVar32 && (long)uVar32 <= (long)uVar49;
                }
                if (bVar68) {
                  psVar52 = psVar59;
                  local_4d0 = (sel_t *)((long)psVar57 + 1);
                  psVar59 = psVar57;
                  oVar31.ptr = true_sel.ptr;
                }
                else {
                  psVar52 = (sel_t *)((long)psVar59 + 1);
                  local_4d0 = psVar57;
                  oVar31.ptr = false_sel.ptr;
                }
                (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
                iVar35 = iVar35 + 1;
                psVar59 = psVar52;
                psVar57 = local_4d0;
              } while (count != iVar35);
            }
            goto LAB_013d4298;
          }
          pdVar11 = left->data;
          puVar10 = (ulong *)right->data;
          _local_4a8 = (undefined1  [16])0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
            local_288._0_8_ = 0x800;
            make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                      ((duckdb *)local_438,(unsigned_long *)&local_288);
            peVar18 = LStack_4a0.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            auVar19 = local_438;
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)LStack_430._0_8_;
            _local_438 = (undefined1  [16])0x0;
            LStack_4a0._0_8_ = auVar19;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
            }
            pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                                 (local_4a8 + 8));
            _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 (pTVar26->owned_data).
                 super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                 super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
                 super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                 super__Head_base<0UL,_unsigned_long_*,_false>;
            local_4a8 = (undefined1  [8])
                        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
            *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
                 0xfffffffffffffffe;
          }
          FlatVector::VerifyFlatVector(left);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d116c;
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar34 = (false_sel.ptr)->sel_vector;
              puVar38 = (ulong *)(pdVar11 + 8);
              lVar48 = 0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if (psVar58 != (sel_t *)0x0) {
                  uVar32 = (ulong)psVar58[uVar49];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_4a8 & 1);
                }
                if (!bVar67 && bVar68 == true) {
                  uVar60 = *puVar38;
                  uVar30 = puVar10[1];
                  bVar68 = *puVar10 < puVar38[-1] && uVar60 == uVar30 ||
                           uVar60 != uVar30 && (long)uVar30 <= (long)uVar60;
                }
                psVar34[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                puVar38 = puVar38 + 2;
              } while (count != uVar49);
              goto LAB_013d116e;
            }
            if (count != 0) {
              psVar58 = (sel.ptr)->sel_vector;
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              psVar34 = (true_sel.ptr)->sel_vector;
              puVar38 = (ulong *)(pdVar11 + 8);
              uVar49 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar32 = uVar49;
                if (psVar58 != (sel_t *)0x0) {
                  uVar32 = (ulong)psVar58[uVar49];
                }
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (bool)(*(byte *)local_4a8 & 1);
                }
                if (!bVar67 && bVar68 == true) {
                  uVar60 = *puVar38;
                  uVar30 = puVar10[1];
                  bVar68 = *puVar10 < puVar38[-1] && uVar60 == uVar30 ||
                           uVar60 != uVar30 && (long)uVar30 <= (long)uVar60;
                }
                psVar34[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar49 = uVar49 + 1;
                puVar38 = puVar38 + 2;
              } while (count != uVar49);
              goto LAB_013d117e;
            }
          }
          else if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            puVar38 = (ulong *)(pdVar11 + 8);
            lVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (!bVar67 && bVar68 == true) {
                uVar60 = *puVar38;
                uVar30 = puVar10[1];
                bVar68 = *puVar10 < puVar38[-1] && uVar60 == uVar30 ||
                         uVar60 != uVar30 && (long)uVar30 <= (long)uVar60;
              }
              psVar34[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              puVar38 = puVar38 + 2;
            } while (count != uVar49);
            goto LAB_013d117e;
          }
        }
        goto LAB_013ce416;
      }
      local_328 = (undefined1  [8])null_mask.ptr;
      if (sel.ptr == (SelectionVector *)0x0) {
        sel.ptr = FlatVector::IncrementalSelectionVector();
      }
      if (local_328 != (undefined1  [8])0x0) {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                  ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
        UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
      }
      VVar3 = left->vector_type;
      VVar4 = right->vector_type;
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar67 = false;
        }
        else {
          bVar67 = (*puVar5 & 1) == 0;
        }
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if (puVar5 == (unsigned_long *)0x0) {
          bVar68 = false;
        }
        else {
          bVar68 = (*puVar5 & 1) == 0;
        }
        if ((bVar67 | bVar68) == 1) {
          bVar68 = (bool)(bVar68 ^ 1);
        }
        else {
          bVar68 = uhugeint_t::operator>((uhugeint_t *)left->data,(uhugeint_t *)right->data);
        }
        if (bVar68 == false) {
          if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
            return (idx_t)(sel_t *)0x0;
          }
          psVar58 = (sel.ptr)->sel_vector;
          psVar34 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          do {
            sVar45 = (sel_t)iVar35;
            if (psVar58 != (sel_t *)0x0) {
              sVar45 = psVar58[iVar35];
            }
            psVar34[iVar35] = sVar45;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          return (idx_t)(sel_t *)0x0;
        }
        if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          psVar34 = (true_sel.ptr)->sel_vector;
          iVar35 = 0;
          do {
            sVar45 = (sel_t)iVar35;
            if (psVar58 != (sel_t *)0x0) {
              sVar45 = psVar58[iVar35];
            }
            psVar34[iVar35] = sVar45;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
          return count;
        }
        return count;
      }
      if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
        puVar42 = (uhugeint_t *)left->data;
        puVar64 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(right);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            lVar48 = 0;
            if (count != 0) {
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                if (local_4a8 == (undefined1  [8])0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(byte *)local_4a8 & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = uhugeint_t::operator>(puVar42,puVar64);
                }
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar49);
            }
            local_4d0 = (sel_t *)(count - lVar48);
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            goto LAB_013d10a4;
          }
          if (count != 0) {
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = uhugeint_t::operator>(puVar42,puVar64);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              puVar64 = puVar64 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar49);
            goto LAB_013d10a4;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = uhugeint_t::operator>(puVar42,puVar64);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            puVar64 = puVar64 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else {
        if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
          if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
            puVar42 = (uhugeint_t *)left->data;
            puVar64 = (uhugeint_t *)right->data;
            FlatVector::VerifyFlatVector(left);
            FlatVector::VerifyFlatVector(right);
            if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              lVar48 = 0;
              local_4d0 = (sel_t *)0x0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = uhugeint_t::operator>(puVar42,puVar64);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                puVar42 = puVar42 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar49);
              return (idx_t)local_4d0;
            }
            if (true_sel.ptr != (SelectionVector *)0x0) {
              if (count == 0) {
                return (idx_t)(sel_t *)0x0;
              }
              uVar49 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = uhugeint_t::operator>(puVar42,puVar64);
                }
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
                uVar49 = uVar49 + 1;
                puVar42 = puVar42 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar49);
              return (idx_t)local_4d0;
            }
            if (count != 0) {
              lVar48 = 0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                  uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
                }
                puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
                }
                puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
                if (puVar5 == (unsigned_long *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = uhugeint_t::operator>(puVar42,puVar64);
                }
                (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
                lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
                uVar49 = uVar49 + 1;
                puVar42 = puVar42 + 1;
                puVar64 = puVar64 + 1;
              } while (count != uVar49);
              goto LAB_013d42e2;
            }
            goto LAB_013d2e1e;
          }
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
          UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
          Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
          Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
          uVar17 = LStack_4a0._0_8_;
          uVar20 = LStack_430._0_8_;
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0 &&
              LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
              if (true_sel.ptr == (SelectionVector *)0x0) {
                if (count == 0) goto LAB_013d40d0;
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                lVar50 = 0;
                iVar35 = 0;
                do {
                  iVar23 = iVar35;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar35];
                  }
                  iVar29 = iVar35;
                  if (lVar48 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                  }
                  iVar36 = iVar35;
                  if (psVar34 != (sel_t *)0x0) {
                    iVar36 = (idx_t)psVar34[iVar35];
                  }
                  bVar67 = uhugeint_t::operator>
                                     ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar36 * 0x10));
                  if (!bVar67) {
                    (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                    lVar50 = lVar50 + 1;
                  }
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
                goto LAB_013d40d2;
              }
              if (count == 0) goto LAB_013d2375;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              iVar35 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                bVar67 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar36 * 0x10));
                if (bVar67) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
            else {
              if (count == 0) goto LAB_013d2375;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              local_4d0 = (sel_t *)0x0;
              iVar35 = 0;
              psVar59 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                bVar67 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar36 * 0x10));
                if (bVar67) {
                  psVar57 = local_4d0;
                  oVar31.ptr = true_sel.ptr;
                  psVar52 = psVar59;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                else {
                  psVar52 = (sel_t *)((long)psVar59 + 1);
                  psVar57 = psVar59;
                  oVar31.ptr = false_sel.ptr;
                }
                (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
                iVar35 = iVar35 + 1;
                psVar59 = psVar52;
              } while (count != iVar35);
            }
          }
          else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0
                  ) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d40d0;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f)
                           & 1) != 0;
                }
                if (!bVar67 && bVar68 == true) {
                  bVar68 = uhugeint_t::operator>
                                     ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                      (uhugeint_t *)(uVar20 + iVar36 * 0x10));
                }
                if (bVar68 == false) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d40d2;
            }
            if (count == 0) goto LAB_013d2375;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            iVar35 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar36 * 0x10));
              }
              if (bVar68 != false) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2375;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = uhugeint_t::operator>
                                   ((uhugeint_t *)(uVar17 + iVar29 * 0x10),
                                    (uhugeint_t *)(uVar20 + iVar36 * 0x10));
              }
              if (bVar68 == false) {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar31.ptr = false_sel.ptr;
              }
              else {
                psVar57 = local_4d0;
                oVar31.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar52;
            } while (count != iVar35);
          }
          goto LAB_013d40df;
        }
        puVar42 = (uhugeint_t *)left->data;
        puVar64 = (uhugeint_t *)right->data;
        _local_4a8 = (undefined1  [16])0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)0x0;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
          local_288._0_8_ = 0x800;
          make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                    ((duckdb *)local_438,(unsigned_long *)&local_288);
          peVar18 = LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          auVar19 = local_438;
          LStack_4a0.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)LStack_430._0_8_;
          _local_438 = (undefined1  [16])0x0;
          LStack_4a0._0_8_ = auVar19;
          if (peVar18 != (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
          }
          pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                              ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                               (local_4a8 + 8));
          _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               (pTVar26->owned_data).
               super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
               super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
               super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
               super__Head_base<0UL,_unsigned_long_*,_false>;
          local_4a8 = (undefined1  [8])
                      _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
          *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
               0xfffffffffffffffe;
        }
        FlatVector::VerifyFlatVector(left);
        if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d108f;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = uhugeint_t::operator>(puVar42,puVar64);
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              puVar42 = puVar42 + 1;
            } while (count != uVar49);
            goto LAB_013d109a;
          }
          if (count != 0) {
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (bool)(*(byte *)local_4a8 & 1);
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = uhugeint_t::operator>(puVar42,puVar64);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              puVar42 = puVar42 + 1;
              local_488._M_pi =
                   (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   LStack_4a0.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            } while (count != uVar49);
            goto LAB_013d10a4;
          }
        }
        else if (count != 0) {
          lVar48 = 0;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = uhugeint_t::operator>(puVar42,puVar64);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            puVar42 = puVar42 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
    }
    goto LAB_013ce350;
  }
  switch(PVar2) {
  case BOOL:
  case INT8:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = (char)*right->data < (char)*left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar11 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_013d116c:
            lVar48 = 0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = (char)pdVar13[uVar49] < (char)*pdVar11;
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
          }
LAB_013d116e:
          local_4d0 = (sel_t *)(count - lVar48);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_013d117e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = (char)pdVar13[uVar49] < (char)*pdVar11;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = (char)pdVar13[uVar49] < (char)*pdVar11;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = (char)pdVar13[uVar49] < (char)pdVar11[uVar49];
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = (char)pdVar13[uVar49] < (char)pdVar11[uVar49];
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = (char)pdVar13[uVar49] < (char)pdVar11[uVar49];
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
LAB_013d2ef7:
          lVar48 = 0;
LAB_013d2ef9:
          return (idx_t)(sel_t *)(count - lVar48);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_013d41ab:
                lVar50 = 0;
              }
              else {
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                lVar50 = 0;
                iVar35 = 0;
                do {
                  iVar23 = iVar35;
                  if (psVar58 != (sel_t *)0x0) {
                    iVar23 = (idx_t)psVar58[iVar35];
                  }
                  iVar29 = iVar35;
                  if (lVar48 != 0) {
                    iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                  }
                  iVar36 = iVar35;
                  if (psVar34 != (sel_t *)0x0) {
                    iVar36 = (idx_t)psVar34[iVar35];
                  }
                  if ((char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29) <=
                      (char)*(data_ptr_t)(LStack_430._0_8_ + iVar36)) {
                    (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                    lVar50 = lVar50 + 1;
                  }
                  iVar35 = iVar35 + 1;
                } while (count != iVar35);
              }
LAB_013d4295:
              local_4d0 = (sel_t *)(count - lVar50);
            }
            else {
              if (count == 0) goto LAB_013d2509;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              local_4d0 = (sel_t *)0x0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if ((char)*(data_ptr_t)(LStack_430._0_8_ + iVar36) <
                    (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29)) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
          }
          else if (count == 0) {
LAB_013d2509:
            local_4d0 = (sel_t *)0x0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if ((char)*(data_ptr_t)(LStack_430._0_8_ + iVar36) <
                  (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
LAB_013d4290:
              lVar50 = 0;
            }
            else {
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f)
                           & 1) != 0;
                }
                if (!bVar67 && bVar68) {
                  bVar68 = (char)*(data_ptr_t)(LStack_430._0_8_ + iVar36) <
                           (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29);
                }
                if (!bVar68) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar35 = 0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = (char)*(data_ptr_t)(LStack_430._0_8_ + iVar36) <
                       (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = (char)*(data_ptr_t)(LStack_430._0_8_ + iVar36) <
                       (char)*(data_ptr_t)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
LAB_013d4298:
        if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
        }
        if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
        }
        local_118.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
             local_488._M_pi;
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
          local_118.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               local_488._M_pi;
        }
        goto LAB_013d117e;
      }
      pdVar11 = left->data;
      pdVar13 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = (char)*pdVar13 < (char)pdVar11[uVar49];
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = (char)*pdVar13 < (char)pdVar11[uVar49];
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = (char)*pdVar13 < (char)pdVar11[uVar49];
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case UINT8:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *right->data < *left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pbVar9 = left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = pdVar11[uVar49] < *pbVar9;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = pdVar11[uVar49] < *pbVar9;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = pdVar11[uVar49] < *pbVar9;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = pdVar13[uVar49] < pdVar11[uVar49];
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = pdVar13[uVar49] < pdVar11[uVar49];
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = pdVar13[uVar49] < pdVar11[uVar49];
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(byte *)(LStack_4a0._0_8_ + iVar29) <= *(byte *)(LStack_430._0_8_ + iVar36)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            iVar35 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(byte *)(LStack_430._0_8_ + iVar36) < *(byte *)(LStack_4a0._0_8_ + iVar29)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(byte *)(LStack_430._0_8_ + iVar36) < *(byte *)(LStack_4a0._0_8_ + iVar29)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(byte *)(LStack_430._0_8_ + iVar36) < *(byte *)(LStack_4a0._0_8_ + iVar29)
                ;
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(byte *)(LStack_430._0_8_ + iVar36) < *(byte *)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(byte *)(LStack_430._0_8_ + iVar36) < *(byte *)(LStack_4a0._0_8_ + iVar29);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      pbVar9 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *pbVar9 < pdVar11[uVar49];
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *pbVar9 < pdVar11[uVar49];
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *pbVar9 < pdVar11[uVar49];
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case UINT16:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(ushort *)right->data < *(ushort *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      puVar8 = (ushort *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(ushort *)(pdVar11 + uVar49 * 2) < *puVar8;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(ushort *)(pdVar11 + uVar49 * 2) < *puVar8;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *(ushort *)(pdVar11 + uVar49 * 2) < *puVar8;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            psVar57 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(ushort *)(pdVar13 + uVar49 * 2) < *(ushort *)(pdVar11 + uVar49 * 2);
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            uVar49 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(ushort *)(pdVar13 + uVar49 * 2) < *(ushort *)(pdVar11 + uVar49 * 2);
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(ushort *)(pdVar13 + uVar49 * 2) < *(ushort *)(pdVar11 + uVar49 * 2);
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(ushort *)(LStack_4a0._0_8_ + iVar29 * 2) <=
                    *(ushort *)(LStack_430._0_8_ + iVar36 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            iVar35 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(ushort *)(LStack_430._0_8_ + iVar36 * 2) <
                  *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(ushort *)(LStack_430._0_8_ + iVar36 * 2) <
                  *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(ushort *)(LStack_430._0_8_ + iVar36 * 2) <
                         *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(ushort *)(LStack_430._0_8_ + iVar36 * 2) <
                       *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(ushort *)(LStack_430._0_8_ + iVar36 * 2) <
                       *(ushort *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      puVar8 = (ushort *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *puVar8 < *(ushort *)(pdVar11 + uVar49 * 2);
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *puVar8 < *(ushort *)(pdVar11 + uVar49 * 2);
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *puVar8 < *(ushort *)(pdVar11 + uVar49 * 2);
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case INT16:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(short *)right->data < *(short *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      psVar7 = (short *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(short *)(pdVar11 + uVar49 * 2) < *psVar7;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(short *)(pdVar11 + uVar49 * 2) < *psVar7;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *(short *)(pdVar11 + uVar49 * 2) < *psVar7;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(short *)(pdVar13 + uVar49 * 2) < *(short *)(pdVar11 + uVar49 * 2);
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(short *)(pdVar13 + uVar49 * 2) < *(short *)(pdVar11 + uVar49 * 2);
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(short *)(pdVar13 + uVar49 * 2) < *(short *)(pdVar11 + uVar49 * 2);
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(short *)(LStack_4a0._0_8_ + iVar29 * 2) <=
                    *(short *)(LStack_430._0_8_ + iVar36 * 2)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(short *)(LStack_430._0_8_ + iVar36 * 2) <
                  *(short *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(short *)(LStack_430._0_8_ + iVar36 * 2) <
                  *(short *)(LStack_4a0._0_8_ + iVar29 * 2)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(short *)(LStack_430._0_8_ + iVar36 * 2) <
                         *(short *)(LStack_4a0._0_8_ + iVar29 * 2);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar35 = 0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(short *)(LStack_430._0_8_ + iVar36 * 2) <
                       *(short *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(short *)(LStack_430._0_8_ + iVar36 * 2) <
                       *(short *)(LStack_4a0._0_8_ + iVar29 * 2);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      psVar7 = (short *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *psVar7 < *(short *)(pdVar11 + uVar49 * 2);
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *psVar7 < *(short *)(pdVar11 + uVar49 * 2);
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *psVar7 < *(short *)(pdVar11 + uVar49 * 2);
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case UINT32:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(uint *)right->data < *(uint *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      puVar6 = (uint *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(uint *)(pdVar11 + uVar49 * 4) < *puVar6;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(uint *)(pdVar11 + uVar49 * 4) < *puVar6;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *(uint *)(pdVar11 + uVar49 * 4) < *puVar6;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            psVar57 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(uint *)(pdVar13 + uVar49 * 4) < *(uint *)(pdVar11 + uVar49 * 4);
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            uVar49 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(uint *)(pdVar13 + uVar49 * 4) < *(uint *)(pdVar11 + uVar49 * 4);
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(uint *)(pdVar13 + uVar49 * 4) < *(uint *)(pdVar11 + uVar49 * 4);
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(uint *)(LStack_4a0._0_8_ + iVar29 * 4) <=
                    *(uint *)(LStack_430._0_8_ + iVar36 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            iVar35 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(uint *)(LStack_430._0_8_ + iVar36 * 4) <
                  *(uint *)(LStack_4a0._0_8_ + iVar29 * 4)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(uint *)(LStack_430._0_8_ + iVar36 * 4) <
                  *(uint *)(LStack_4a0._0_8_ + iVar29 * 4)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(uint *)(LStack_430._0_8_ + iVar36 * 4) <
                         *(uint *)(LStack_4a0._0_8_ + iVar29 * 4);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(uint *)(LStack_430._0_8_ + iVar36 * 4) <
                       *(uint *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(uint *)(LStack_430._0_8_ + iVar36 * 4) <
                       *(uint *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      puVar6 = (uint *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *puVar6 < *(uint *)(pdVar11 + uVar49 * 4);
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *puVar6 < *(uint *)(pdVar11 + uVar49 * 4);
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *puVar6 < *(uint *)(pdVar11 + uVar49 * 4);
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case INT32:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(int *)right->data < *(int *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar44 = (int *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(int *)(pdVar11 + uVar49 * 4) < *piVar44;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(int *)(pdVar11 + uVar49 * 4) < *piVar44;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *(int *)(pdVar11 + uVar49 * 4) < *piVar44;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(int *)(pdVar13 + uVar49 * 4) < *(int *)(pdVar11 + uVar49 * 4);
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(int *)(pdVar13 + uVar49 * 4) < *(int *)(pdVar11 + uVar49 * 4);
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(int *)(pdVar13 + uVar49 * 4) < *(int *)(pdVar11 + uVar49 * 4);
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(int *)(LStack_4a0._0_8_ + iVar29 * 4) <=
                    *(int *)(LStack_430._0_8_ + iVar36 * 4)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(int *)(LStack_430._0_8_ + iVar36 * 4) < *(int *)(LStack_4a0._0_8_ + iVar29 * 4))
              {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(int *)(LStack_430._0_8_ + iVar36 * 4) < *(int *)(LStack_4a0._0_8_ + iVar29 * 4))
              {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(int *)(LStack_430._0_8_ + iVar36 * 4) <
                         *(int *)(LStack_4a0._0_8_ + iVar29 * 4);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar35 = 0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(int *)(LStack_430._0_8_ + iVar36 * 4) <
                       *(int *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(int *)(LStack_430._0_8_ + iVar36 * 4) <
                       *(int *)(LStack_4a0._0_8_ + iVar29 * 4);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      piVar44 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *piVar44 < *(int *)(pdVar11 + uVar49 * 4);
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *piVar44 < *(int *)(pdVar11 + uVar49 * 4);
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *piVar44 < *(int *)(pdVar11 + uVar49 * 4);
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case UINT64:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(ulong *)right->data < *(ulong *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      puVar10 = (ulong *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(ulong *)(pdVar11 + uVar49 * 8) < *puVar10;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(ulong *)(pdVar11 + uVar49 * 8) < *puVar10;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *(ulong *)(pdVar11 + uVar49 * 8) < *puVar10;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            psVar57 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(ulong *)(pdVar13 + uVar49 * 8) < *(ulong *)(pdVar11 + uVar49 * 8);
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            uVar49 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(ulong *)(pdVar13 + uVar49 * 8) < *(ulong *)(pdVar11 + uVar49 * 8);
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(ulong *)(pdVar13 + uVar49 * 8) < *(ulong *)(pdVar11 + uVar49 * 8);
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(ulong *)(LStack_4a0._0_8_ + iVar29 * 8) <=
                    *(ulong *)(LStack_430._0_8_ + iVar36 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            iVar35 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(ulong *)(LStack_430._0_8_ + iVar36 * 8) <
                  *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(ulong *)(LStack_430._0_8_ + iVar36 * 8) <
                  *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(ulong *)(LStack_430._0_8_ + iVar36 * 8) <
                         *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(ulong *)(LStack_430._0_8_ + iVar36 * 8) <
                       *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(ulong *)(LStack_430._0_8_ + iVar36 * 8) <
                       *(ulong *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      puVar10 = (ulong *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *puVar10 < *(ulong *)(pdVar11 + uVar49 * 8);
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *puVar10 < *(ulong *)(pdVar11 + uVar49 * 8);
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *puVar10 < *(ulong *)(pdVar11 + uVar49 * 8);
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  case INT64:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = *(long *)right->data < *(long *)left->data;
      }
      if (!bVar68) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      plVar37 = (long *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(long *)(pdVar11 + uVar49 * 8) < *plVar37;
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *(long *)(pdVar11 + uVar49 * 8) < *plVar37;
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *(long *)(pdVar11 + uVar49 * 8) < *plVar37;
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            psVar57 = (sel_t *)0x0;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(long *)(pdVar13 + uVar49 * 8) < *(long *)(pdVar11 + uVar49 * 8);
              }
              psVar34[(long)psVar57] = (sel_t)uVar32;
              psVar57 = (sel_t *)((long)psVar57 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar57;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(long *)(pdVar13 + uVar49 * 8) < *(long *)(pdVar11 + uVar49 * 8);
              }
              psVar34[(long)psVar59] = (sel_t)uVar32;
              psVar59 = (sel_t *)((long)psVar59 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            return (idx_t)psVar59;
          }
          if (count != 0) {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = *(long *)(pdVar13 + uVar49 * 8) < *(long *)(pdVar11 + uVar49 * 8);
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
            goto LAB_013d2ef9;
          }
          goto LAB_013d2ef7;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d41ab;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (*(long *)(LStack_4a0._0_8_ + iVar29 * 8) <=
                    *(long *)(LStack_430._0_8_ + iVar36 * 8)) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                  lVar50 = lVar50 + 1;
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
              goto LAB_013d4295;
            }
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(long *)(LStack_430._0_8_ + iVar36 * 8) <
                  *(long *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
          else {
            if (count == 0) goto LAB_013d2509;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (*(long *)(LStack_430._0_8_ + iVar36 * 8) <
                  *(long *)(LStack_4a0._0_8_ + iVar29 * 8)) {
                oVar31.ptr = true_sel.ptr;
                psVar57 = psVar59;
                psVar59 = local_4d0;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar57 = (sel_t *)((long)psVar59 + 1);
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
              psVar59 = psVar57;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d4290;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68) {
                bVar68 = *(long *)(LStack_430._0_8_ + iVar36 * 8) <
                         *(long *)(LStack_4a0._0_8_ + iVar29 * 8);
              }
              if (!bVar68) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d4295;
          }
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_4d0 = (sel_t *)0x0;
          iVar35 = 0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(long *)(LStack_430._0_8_ + iVar36 * 8) <
                       *(long *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2509;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          psVar57 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              bVar68 = *(long *)(LStack_430._0_8_ + iVar36 * 8) <
                       *(long *)(LStack_4a0._0_8_ + iVar29 * 8);
            }
            if (bVar68) {
              psVar52 = psVar59;
              local_4d0 = (sel_t *)((long)psVar57 + 1);
              psVar59 = psVar57;
              oVar31.ptr = true_sel.ptr;
            }
            else {
              psVar52 = (sel_t *)((long)psVar59 + 1);
              local_4d0 = psVar57;
              oVar31.ptr = false_sel.ptr;
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = psVar52;
            psVar57 = local_4d0;
          } while (count != iVar35);
        }
        goto LAB_013d4298;
      }
      pdVar11 = left->data;
      plVar37 = (long *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d116c;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *plVar37 < *(long *)(pdVar11 + uVar49 * 8);
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d116e;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          local_4d0 = (sel_t *)0x0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = *plVar37 < *(long *)(pdVar11 + uVar49 * 8);
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
          } while (count != uVar49);
          goto LAB_013d117e;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        local_4d0 = (sel_t *)0x0;
        lVar48 = 0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = *plVar37 < *(long *)(pdVar11 + uVar49 * 8);
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
        } while (count != uVar49);
        goto LAB_013d117e;
      }
    }
    break;
  default:
switchD_013c4dc2_caseD_a:
    this_02 = (InternalException *)__cxa_allocate_exception(0x10);
    local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
    ::std::__cxx11::string::_M_construct<char_const*>
              ((string *)local_4a8,"Invalid type for distinct selection","");
    InternalException::InternalException(this_02,(string *)local_4a8);
    __cxa_throw(this_02,&InternalException::typeinfo,::std::runtime_error::~runtime_error);
  case FLOAT:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bVar67 | bVar68) == 1) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = GreaterThan::Operation<float>((float *)left->data,(float *)right->data);
      }
      if (bVar68 == false) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pfVar39 = (float *)left->data;
      pfVar61 = (float *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_013ced10:
            lVar48 = 0;
          }
          else {
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              pfVar61 = pfVar61 + 1;
            } while (count != uVar49);
          }
LAB_013d109a:
          local_4d0 = (sel_t *)(count - lVar48);
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          goto LAB_013d10a4;
        }
        if (count != 0) {
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
            pfVar61 = pfVar61 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else if (count != 0) {
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
          pfVar61 = pfVar61 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar49);
        goto LAB_013d10a4;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pfVar39 = (float *)left->data;
          pfVar61 = (float *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            lVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              pfVar39 = pfVar39 + 1;
              pfVar61 = pfVar61 + 1;
            } while (count != uVar49);
            return (idx_t)local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              pfVar39 = pfVar39 + 1;
              pfVar61 = pfVar61 + 1;
            } while (count != uVar49);
            return (idx_t)local_4d0;
          }
          if (count != 0) {
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              pfVar39 = pfVar39 + 1;
              pfVar61 = pfVar61 + 1;
            } while (count != uVar49);
            goto LAB_013d42e2;
          }
LAB_013d2e1e:
          lVar48 = 0;
LAB_013d42e2:
          return (idx_t)(sel_t *)(count - lVar48);
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        uVar17 = LStack_4a0._0_8_;
        uVar20 = LStack_430._0_8_;
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
LAB_013d40d0:
                lVar50 = 0;
              }
              else {
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                lVar50 = 0;
                uVar49 = 0;
                do {
                  uVar32 = uVar49;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar32 = (ulong)psVar58[uVar49];
                  }
                  uVar60 = uVar49;
                  if (lVar48 != 0) {
                    uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
                  }
                  uVar30 = uVar49;
                  if (psVar34 != (sel_t *)0x0) {
                    uVar30 = (ulong)psVar34[uVar49];
                  }
                  bVar67 = GreaterThan::Operation<float>
                                     ((float *)(uVar17 + uVar60 * 4),(float *)(uVar20 + uVar30 * 4))
                  ;
                  if (!bVar67) {
                    (false_sel.ptr)->sel_vector[lVar50] = (sel_t)uVar32;
                    lVar50 = lVar50 + 1;
                  }
                  uVar49 = uVar49 + 1;
                } while (count != uVar49);
              }
LAB_013d40d2:
              local_4d0 = (sel_t *)(count - lVar50);
            }
            else {
              if (count == 0) goto LAB_013d2375;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              uVar49 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                uVar32 = uVar49;
                if (psVar58 != (sel_t *)0x0) {
                  uVar32 = (ulong)psVar58[uVar49];
                }
                uVar60 = uVar49;
                if (lVar48 != 0) {
                  uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
                }
                uVar30 = uVar49;
                if (psVar34 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar34[uVar49];
                }
                bVar67 = GreaterThan::Operation<float>
                                   ((float *)(uVar17 + uVar60 * 4),(float *)(uVar20 + uVar30 * 4));
                if (bVar67) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                uVar49 = uVar49 + 1;
              } while (count != uVar49);
            }
          }
          else if (count == 0) {
LAB_013d2375:
            local_4d0 = (sel_t *)0x0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              uVar60 = uVar49;
              if (lVar48 != 0) {
                uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
              }
              uVar30 = uVar49;
              if (psVar34 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar34[uVar49];
              }
              bVar67 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + uVar60 * 4),(float *)(uVar20 + uVar30 * 4));
              if (bVar67) {
                psVar57 = local_4d0;
                oVar31.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)uVar32;
              uVar49 = uVar49 + 1;
              psVar59 = psVar52;
            } while (count != uVar49);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d40d0;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<float>
                                   ((float *)(uVar17 + iVar29 * 4),(float *)(uVar20 + iVar36 * 4));
              }
              if (bVar68 == false) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d40d2;
          }
          if (count == 0) goto LAB_013d2375;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + iVar29 * 4),(float *)(uVar20 + iVar36 * 4));
            }
            if (bVar68 != false) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2375;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_4b8 = (sel_t *)0x0;
          local_4d0 = (sel_t *)0x0;
          iVar35 = 0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<float>
                                 ((float *)(uVar17 + iVar29 * 4),(float *)(uVar20 + iVar36 * 4));
            }
            if (bVar68 == false) {
              psVar59 = local_4b8;
              oVar31.ptr = false_sel.ptr;
              local_4b8 = (sel_t *)((long)local_4b8 + 1);
            }
            else {
              psVar59 = local_4d0;
              oVar31.ptr = true_sel.ptr;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
LAB_013d40df:
        if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
        }
        if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
        }
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
        }
        goto LAB_013d10a4;
      }
      pfVar39 = (float *)left->data;
      pfVar61 = (float *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d108f;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
            }
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            pfVar39 = pfVar39 + 1;
          } while (count != uVar49);
          goto LAB_013d109a;
        }
        if (count != 0) {
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
            pfVar39 = pfVar39 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else if (count != 0) {
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
          }
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = GreaterThan::Operation<float>(pfVar39,pfVar61);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
          pfVar39 = pfVar39 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar49);
        goto LAB_013d10a4;
      }
    }
    goto LAB_013ce350;
  case DOUBLE:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bVar67 | bVar68) == 1) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        bVar68 = GreaterThan::Operation<double>((double *)left->data,(double *)right->data);
      }
      if (bVar68 == false) {
        if (false_sel.ptr == (SelectionVector *)0x0 || count == 0) {
          return (idx_t)(sel_t *)0x0;
        }
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return (idx_t)(sel_t *)0x0;
      }
      if (true_sel.ptr != (SelectionVector *)0x0 && count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      pdVar40 = (double *)left->data;
      pdVar62 = (double *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013ced10;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
            }
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            pdVar62 = pdVar62 + 1;
          } while (count != uVar49);
          goto LAB_013d109a;
        }
        if (count != 0) {
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
            pdVar62 = pdVar62 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else if (count != 0) {
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
          pdVar62 = pdVar62 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar49);
        goto LAB_013d10a4;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar40 = (double *)left->data;
          pdVar62 = (double *)right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            lVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              pdVar40 = pdVar40 + 1;
              pdVar62 = pdVar62 + 1;
            } while (count != uVar49);
            return (idx_t)local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
              }
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              pdVar40 = pdVar40 + 1;
              pdVar62 = pdVar62 + 1;
            } while (count != uVar49);
            return (idx_t)local_4d0;
          }
          if (count != 0) {
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
                uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
              }
              puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
              }
              (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              pdVar40 = pdVar40 + 1;
              pdVar62 = pdVar62 + 1;
            } while (count != uVar49);
            goto LAB_013d42e2;
          }
          goto LAB_013d2e1e;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        uVar17 = LStack_4a0._0_8_;
        uVar20 = LStack_430._0_8_;
        if (LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) goto LAB_013d40d0;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              lVar50 = 0;
              uVar49 = 0;
              do {
                uVar32 = uVar49;
                if (psVar58 != (sel_t *)0x0) {
                  uVar32 = (ulong)psVar58[uVar49];
                }
                uVar60 = uVar49;
                if (lVar48 != 0) {
                  uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
                }
                uVar30 = uVar49;
                if (psVar34 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar34[uVar49];
                }
                bVar67 = GreaterThan::Operation<double>
                                   ((double *)(uVar17 + uVar60 * 8),(double *)(uVar20 + uVar30 * 8))
                ;
                if (!bVar67) {
                  (false_sel.ptr)->sel_vector[lVar50] = (sel_t)uVar32;
                  lVar50 = lVar50 + 1;
                }
                uVar49 = uVar49 + 1;
              } while (count != uVar49);
              goto LAB_013d40d2;
            }
            if (count == 0) goto LAB_013d2375;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              uVar60 = uVar49;
              if (lVar48 != 0) {
                uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
              }
              uVar30 = uVar49;
              if (psVar34 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar34[uVar49];
              }
              bVar67 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + uVar60 * 8),(double *)(uVar20 + uVar30 * 8));
              if (bVar67) {
                (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              uVar49 = uVar49 + 1;
            } while (count != uVar49);
          }
          else {
            if (count == 0) goto LAB_013d2375;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            psVar59 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              uVar60 = uVar49;
              if (lVar48 != 0) {
                uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
              }
              uVar30 = uVar49;
              if (psVar34 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar34[uVar49];
              }
              bVar67 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + uVar60 * 8),(double *)(uVar20 + uVar30 * 8));
              if (bVar67) {
                psVar57 = local_4d0;
                oVar31.ptr = true_sel.ptr;
                psVar52 = psVar59;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar52 = (sel_t *)((long)psVar59 + 1);
                psVar57 = psVar59;
                oVar31.ptr = false_sel.ptr;
              }
              (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)uVar32;
              uVar49 = uVar49 + 1;
              psVar59 = psVar52;
            } while (count != uVar49);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) goto LAB_013d40d0;
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            psVar34 = *(sel_t **)local_438;
            lVar50 = 0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (psVar34 != (sel_t *)0x0) {
                iVar36 = (idx_t)psVar34[iVar35];
              }
              if (LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                           ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0
                ;
              }
              if (LStack_430.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                  (element_type *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                   ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) &
                         1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                bVar68 = GreaterThan::Operation<double>
                                   ((double *)(uVar17 + iVar29 * 8),(double *)(uVar20 + iVar36 * 8))
                ;
              }
              if (bVar68 == false) {
                (false_sel.ptr)->sel_vector[lVar50] = (sel_t)iVar23;
                lVar50 = lVar50 + 1;
              }
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
            goto LAB_013d40d2;
          }
          if (count == 0) goto LAB_013d2375;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + iVar29 * 8),(double *)(uVar20 + iVar36 * 8));
            }
            if (bVar68 != false) {
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d2375;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_4b8 = (sel_t *)0x0;
          local_4d0 = (sel_t *)0x0;
          iVar35 = 0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>
                                 ((double *)(uVar17 + iVar29 * 8),(double *)(uVar20 + iVar36 * 8));
            }
            if (bVar68 == false) {
              psVar59 = local_4b8;
              oVar31.ptr = false_sel.ptr;
              local_4b8 = (sel_t *)((long)local_4b8 + 1);
            }
            else {
              psVar59 = local_4d0;
              oVar31.ptr = true_sel.ptr;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            (oVar31.ptr)->sel_vector[(long)psVar59] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        goto LAB_013d40df;
      }
      pdVar40 = (double *)left->data;
      pdVar62 = (double *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d108f;
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
            }
            (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            pdVar40 = pdVar40 + 1;
          } while (count != uVar49);
          goto LAB_013d109a;
        }
        if (count != 0) {
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
              uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
            }
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
            }
            (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
            pdVar40 = pdVar40 + 1;
            local_488._M_pi =
                 (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                 LStack_4a0.type_info_.internal.
                 super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else if (count != 0) {
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if ((sel.ptr)->sel_vector != (sel_t *)0x0) {
            uVar32 = (ulong)(sel.ptr)->sel_vector[uVar49];
          }
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            bVar68 = GreaterThan::Operation<double>(pdVar40,pdVar62);
          }
          (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          (false_sel.ptr)->sel_vector[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
          pdVar40 = pdVar40 + 1;
          local_488._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
               LStack_4a0.type_info_.internal.
               super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        } while (count != uVar49);
        goto LAB_013d10a4;
      }
    }
    goto LAB_013ce350;
  case INTERVAL:
    local_328 = (undefined1  [8])null_mask.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      sel.ptr = FlatVector::IncrementalSelectionVector();
    }
    if (local_328 != (undefined1  [8])0x0) {
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(left,sel.ptr,count,(ValidityMask *)local_328);
      optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                ((optional_ptr<duckdb::ValidityMask,_true> *)local_328);
      UpdateNullMask(right,sel.ptr,count,(ValidityMask *)local_328);
    }
    VVar3 = left->vector_type;
    VVar4 = right->vector_type;
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && (VVar4 ^ CONSTANT_VECTOR) == FLAT_VECTOR) {
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar67 = false;
      }
      else {
        bVar67 = (*puVar5 & 1) == 0;
      }
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if (puVar5 == (unsigned_long *)0x0) {
        bVar68 = false;
      }
      else {
        bVar68 = (*puVar5 & 1) == 0;
      }
      if ((bool)(bVar67 | bVar68)) {
        bVar68 = (bool)(bVar68 ^ 1);
      }
      else {
        piVar44 = (int *)left->data;
        piVar55 = (int *)right->data;
        lVar48 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
        lVar51 = lVar48 % 0x1e;
        lVar54 = (long)*piVar44 + lVar48 / 0x1e;
        lVar50 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
        lVar48 = lVar50 % 0x1e;
        lVar50 = (long)*piVar55 + lVar50 / 0x1e;
        if (lVar50 < lVar54) goto LAB_013ca79e;
        if (lVar54 < lVar50) goto LAB_013cb2ce;
        if (lVar48 < lVar51) goto LAB_013ca79e;
        bVar68 = *(long *)(piVar55 + 2) % 86400000000 < *(long *)(piVar44 + 2) % 86400000000 &&
                 lVar48 <= lVar51;
      }
      if (!bVar68) {
LAB_013cb2ce:
        if (count != 0 && false_sel.ptr != (SelectionVector *)0x0) {
          psVar58 = (sel.ptr)->sel_vector;
          psVar34 = (false_sel.ptr)->sel_vector;
          iVar35 = 0;
          do {
            sVar45 = (sel_t)iVar35;
            if (psVar58 != (sel_t *)0x0) {
              sVar45 = psVar58[iVar35];
            }
            psVar34[iVar35] = sVar45;
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        return (idx_t)(sel_t *)0x0;
      }
LAB_013ca79e:
      if (count != 0 && true_sel.ptr != (SelectionVector *)0x0) {
        psVar58 = (sel.ptr)->sel_vector;
        psVar34 = (true_sel.ptr)->sel_vector;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          psVar34[iVar35] = sVar45;
          iVar35 = iVar35 + 1;
        } while (count != iVar35);
        return count;
      }
      return count;
    }
    if ((VVar3 ^ CONSTANT_VECTOR) == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
      piVar44 = (int *)left->data;
      pdVar11 = right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(right);
      local_488._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) {
LAB_013d108f:
            lVar48 = 0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            plVar37 = (long *)(pdVar11 + 8);
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (local_4a8 == (undefined1  [8])0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (*(byte *)local_4a8 & 1) == 0;
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                lVar54 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
                lVar65 = (long)*piVar44 + lVar54 / 0x1e;
                lVar50 = (long)*(int *)((long)plVar37 + -4) + *plVar37 / 86400000000;
                lVar51 = (long)(int)plVar37[-1] + lVar50 / 0x1e;
                bVar68 = true;
                if (lVar65 <= lVar51) {
                  if (lVar65 < lVar51) {
                    bVar68 = false;
                  }
                  else {
                    lVar54 = lVar54 % 0x1e;
                    lVar50 = lVar50 % 0x1e;
                    if (lVar54 <= lVar50) {
                      bVar68 = *plVar37 % 86400000000 < *(long *)(piVar44 + 2) % 86400000000 &&
                               lVar50 <= lVar54;
                    }
                  }
                }
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              plVar37 = plVar37 + 2;
            } while (count != uVar49);
          }
          goto LAB_013d109a;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          plVar37 = (long *)(pdVar11 + 8);
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(byte *)local_4a8 & 1) == 0;
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
            }
            if (!bVar67 && bVar68 == true) {
              lVar51 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
              lVar54 = (long)*piVar44 + lVar51 / 0x1e;
              lVar48 = (long)*(int *)((long)plVar37 + -4) + *plVar37 / 86400000000;
              lVar50 = (long)(int)plVar37[-1] + lVar48 / 0x1e;
              bVar68 = true;
              if (lVar54 <= lVar50) {
                if (lVar54 < lVar50) {
                  bVar68 = false;
                }
                else {
                  lVar51 = lVar51 % 0x1e;
                  lVar48 = lVar48 % 0x1e;
                  if (lVar51 <= lVar48) {
                    bVar68 = *plVar37 % 86400000000 < *(long *)(piVar44 + 2) % 86400000000 &&
                             lVar48 <= lVar51;
                  }
                }
              }
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
            plVar37 = plVar37 + 2;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        psVar34 = (true_sel.ptr)->sel_vector;
        psVar59 = (false_sel.ptr)->sel_vector;
        plVar37 = (long *)(pdVar11 + 8);
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(byte *)local_4a8 & 1) == 0;
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
          }
          if (!bVar67 && bVar68 == true) {
            lVar54 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
            lVar51 = (long)*piVar44 + lVar54 / 0x1e;
            lVar50 = (long)*(int *)((long)plVar37 + -4) + *plVar37 / 86400000000;
            lVar65 = (long)(int)plVar37[-1] + lVar50 / 0x1e;
            bVar68 = true;
            if (lVar51 <= lVar65) {
              if (lVar51 < lVar65) {
                bVar68 = false;
              }
              else {
                lVar54 = lVar54 % 0x1e;
                lVar50 = lVar50 % 0x1e;
                if (lVar54 <= lVar50) {
                  bVar68 = *plVar37 % 86400000000 < *(long *)(piVar44 + 2) % 86400000000 &&
                           lVar50 <= lVar54;
                }
              }
            }
          }
          psVar34[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar59[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
          plVar37 = plVar37 + 2;
        } while (count != uVar49);
        goto LAB_013d10a4;
      }
    }
    else {
      if ((VVar4 ^ CONSTANT_VECTOR) != FLAT_VECTOR || VVar3 != FLAT_VECTOR) {
        if (VVar3 == FLAT_VECTOR && VVar4 == FLAT_VECTOR) {
          pdVar11 = left->data;
          pdVar13 = right->data;
          FlatVector::VerifyFlatVector(left);
          FlatVector::VerifyFlatVector(right);
          if (false_sel.ptr != (SelectionVector *)0x0 && true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            psVar59 = (false_sel.ptr)->sel_vector;
            lVar50 = 8;
            lVar48 = 0;
            local_4d0 = (sel_t *)0x0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                lVar65 = (long)*(int *)(pdVar11 + lVar50 + -4) +
                         *(long *)(pdVar11 + lVar50) / 86400000000;
                lVar54 = (long)*(int *)(pdVar11 + lVar50 + -8) + lVar65 / 0x1e;
                lVar51 = (long)*(int *)(pdVar13 + lVar50 + -4) +
                         *(long *)(pdVar13 + lVar50) / 86400000000;
                lVar66 = (long)*(int *)(pdVar13 + lVar50 + -8) + lVar51 / 0x1e;
                bVar68 = true;
                if (lVar54 <= lVar66) {
                  if (lVar54 < lVar66) {
                    bVar68 = false;
                  }
                  else {
                    lVar65 = lVar65 % 0x1e;
                    lVar51 = lVar51 % 0x1e;
                    if (lVar65 <= lVar51) {
                      bVar68 = *(long *)(pdVar13 + lVar50) % 86400000000 <
                               *(long *)(pdVar11 + lVar50) % 86400000000 && lVar51 <= lVar65;
                    }
                  }
                }
              }
              psVar34[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              psVar59[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              lVar50 = lVar50 + 0x10;
            } while (count != uVar49);
            return (idx_t)local_4d0;
          }
          if (true_sel.ptr != (SelectionVector *)0x0) {
            if (count == 0) {
              return (idx_t)(sel_t *)0x0;
            }
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (true_sel.ptr)->sel_vector;
            lVar48 = 8;
            uVar49 = 0;
            local_4d0 = (sel_t *)0x0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                lVar54 = (long)*(int *)(pdVar11 + lVar48 + -4) +
                         *(long *)(pdVar11 + lVar48) / 86400000000;
                lVar65 = (long)*(int *)(pdVar11 + lVar48 + -8) + lVar54 / 0x1e;
                lVar50 = (long)*(int *)(pdVar13 + lVar48 + -4) +
                         *(long *)(pdVar13 + lVar48) / 86400000000;
                lVar51 = (long)*(int *)(pdVar13 + lVar48 + -8) + lVar50 / 0x1e;
                bVar68 = true;
                if (lVar65 <= lVar51) {
                  if (lVar65 < lVar51) {
                    bVar68 = false;
                  }
                  else {
                    lVar54 = lVar54 % 0x1e;
                    lVar50 = lVar50 % 0x1e;
                    if (lVar54 <= lVar50) {
                      bVar68 = *(long *)(pdVar13 + lVar48) % 86400000000 <
                               *(long *)(pdVar11 + lVar48) % 86400000000 && lVar50 <= lVar54;
                    }
                  }
                }
              }
              psVar34[(long)local_4d0] = (sel_t)uVar32;
              local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
              uVar49 = uVar49 + 1;
              lVar48 = lVar48 + 0x10;
            } while (count != uVar49);
            return (idx_t)local_4d0;
          }
          if (count == 0) {
            lVar48 = 0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            puVar14 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
            psVar34 = (false_sel.ptr)->sel_vector;
            lVar50 = 8;
            lVar48 = 0;
            uVar49 = 0;
            do {
              uVar32 = uVar49;
              if (psVar58 != (sel_t *)0x0) {
                uVar32 = (ulong)psVar58[uVar49];
              }
              if (puVar5 == (unsigned_long *)0x0) {
                bVar67 = false;
              }
              else {
                bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
              }
              if (puVar14 == (unsigned_long *)0x0) {
                bVar68 = true;
              }
              else {
                bVar68 = (puVar14[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) != 0;
              }
              if (!bVar67 && bVar68 == true) {
                lVar65 = (long)*(int *)(pdVar11 + lVar50 + -4) +
                         *(long *)(pdVar11 + lVar50) / 86400000000;
                lVar54 = (long)*(int *)(pdVar11 + lVar50 + -8) + lVar65 / 0x1e;
                lVar51 = (long)*(int *)(pdVar13 + lVar50 + -4) +
                         *(long *)(pdVar13 + lVar50) / 86400000000;
                lVar66 = (long)*(int *)(pdVar13 + lVar50 + -8) + lVar51 / 0x1e;
                bVar68 = true;
                if (lVar54 <= lVar66) {
                  if (lVar54 < lVar66) {
                    bVar68 = false;
                  }
                  else {
                    lVar65 = lVar65 % 0x1e;
                    lVar51 = lVar51 % 0x1e;
                    if (lVar65 <= lVar51) {
                      bVar68 = *(long *)(pdVar13 + lVar50) % 86400000000 <
                               *(long *)(pdVar11 + lVar50) % 86400000000 && lVar51 <= lVar65;
                    }
                  }
                }
              }
              psVar34[lVar48] = (sel_t)uVar32;
              lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
              uVar49 = uVar49 + 1;
              lVar50 = lVar50 + 0x10;
            } while (count != uVar49);
          }
          goto LAB_013d42e2;
        }
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
        UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
        Vector::ToUnifiedFormat(left,count,(UnifiedVectorFormat *)local_4a8);
        Vector::ToUnifiedFormat(right,count,(UnifiedVectorFormat *)local_438);
        if (LStack_4a0.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0 &&
            LStack_430.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
            (element_type *)0x0) {
          if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
            if (true_sel.ptr == (SelectionVector *)0x0) {
              if (count == 0) {
                local_4b0 = 0;
                local_4c0 = local_4b0;
              }
              else {
                psVar58 = (sel.ptr)->sel_vector;
                lVar48 = *(long *)local_4a8;
                psVar34 = *(sel_t **)local_438;
                local_4b0 = 0;
                uVar49 = 0;
                do {
                  uVar32 = uVar49;
                  if (psVar58 != (sel_t *)0x0) {
                    uVar32 = (ulong)psVar58[uVar49];
                  }
                  uVar60 = uVar49;
                  if (lVar48 != 0) {
                    uVar60 = (ulong)*(uint *)(lVar48 + uVar49 * 4);
                  }
                  uVar30 = uVar49;
                  if (psVar34 != (sel_t *)0x0) {
                    uVar30 = (ulong)psVar34[uVar49];
                  }
                  lVar54 = uVar30 * 0x10;
                  lVar50 = (long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10 + 4) +
                           *(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) / 86400000000;
                  lVar65 = lVar50 % 0x1e;
                  lVar66 = (long)*(int *)(LStack_4a0._0_8_ + uVar60 * 0x10) + lVar50 / 0x1e;
                  lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54 + 4) +
                           *(long *)(LStack_430._0_8_ + lVar54 + 8) / 86400000000;
                  lVar50 = lVar51 % 0x1e;
                  lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54) + lVar51 / 0x1e;
                  if ((lVar66 <= lVar51) &&
                     ((lVar66 < lVar51 ||
                      ((lVar65 <= lVar50 &&
                       ((lVar65 < lVar50 ||
                        (*(long *)(LStack_4a0._0_8_ + (uVar60 * 2 + 1) * 8) % 86400000000 <=
                         *(long *)(LStack_430._0_8_ + lVar54 + 8) % 86400000000)))))))) {
                    (false_sel.ptr)->sel_vector[local_4b0] = (sel_t)uVar32;
                    local_4b0 = local_4b0 + 1;
                  }
                  uVar49 = uVar49 + 1;
                  local_4c0 = local_4b0;
                } while (count != uVar49);
              }
LAB_013d4314:
              local_4d0 = (sel_t *)(count - local_4c0);
            }
            else {
              if (count == 0) goto LAB_013d165d;
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              iVar35 = 0;
              local_4d0 = (sel_t *)0x0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                lVar54 = iVar36 * 0x10;
                lVar50 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10 + 4) +
                         *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) / 86400000000;
                lVar65 = lVar50 % 0x1e;
                lVar66 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10) + lVar50 / 0x1e;
                lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54 + 4) +
                         *(long *)(LStack_430._0_8_ + lVar54 + 8) / 86400000000;
                lVar50 = lVar51 % 0x1e;
                lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar54) + lVar51 / 0x1e;
                if ((lVar51 < lVar66) ||
                   ((lVar51 <= lVar66 &&
                    ((lVar50 < lVar65 ||
                     ((lVar50 <= lVar65 &&
                      (*(long *)(LStack_430._0_8_ + lVar54 + 8) % 86400000000 <
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) % 86400000000)))))))) {
                  (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
                  local_4d0 = (sel_t *)((long)local_4d0 + 1);
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
          }
          else if (count == 0) {
LAB_013d165d:
            local_4d0 = (sel_t *)0x0;
          }
          else {
            psVar58 = (sel.ptr)->sel_vector;
            lVar48 = *(long *)local_4a8;
            local_3c8 = *(sel_t **)local_438;
            local_388 = (sel_t *)0x0;
            local_4d0 = (sel_t *)0x0;
            iVar35 = 0;
            do {
              iVar23 = iVar35;
              if (psVar58 != (sel_t *)0x0) {
                iVar23 = (idx_t)psVar58[iVar35];
              }
              iVar29 = iVar35;
              if (lVar48 != 0) {
                iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
              }
              iVar36 = iVar35;
              if (local_3c8 != (sel_t *)0x0) {
                iVar36 = (idx_t)local_3c8[iVar35];
              }
              lVar65 = iVar36 * 0x10;
              lVar50 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10 + 4) +
                       *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) / 86400000000;
              lVar66 = lVar50 % 0x1e;
              lVar54 = (long)*(int *)(LStack_4a0._0_8_ + iVar29 * 0x10) + lVar50 / 0x1e;
              lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar65 + 4) +
                       *(long *)(LStack_430._0_8_ + lVar65 + 8) / 86400000000;
              lVar50 = lVar51 % 0x1e;
              lVar51 = (long)*(int *)(LStack_430._0_8_ + lVar65) + lVar51 / 0x1e;
              if ((lVar51 < lVar54) ||
                 ((lVar51 <= lVar54 &&
                  ((lVar50 < lVar66 ||
                   ((lVar50 <= lVar66 &&
                    (*(long *)(LStack_430._0_8_ + lVar65 + 8) % 86400000000 <
                     *(long *)(LStack_4a0._0_8_ + (iVar29 * 2 + 1) * 8) % 86400000000)))))))) {
                psVar34 = local_4d0;
                oVar31.ptr = true_sel.ptr;
                local_4d0 = (sel_t *)((long)local_4d0 + 1);
              }
              else {
                psVar34 = local_388;
                oVar31.ptr = false_sel.ptr;
                local_388 = (sel_t *)((long)local_388 + 1);
              }
              (oVar31.ptr)->sel_vector[(long)psVar34] = (sel_t)iVar23;
              iVar35 = iVar35 + 1;
            } while (count != iVar35);
          }
        }
        else if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0)
        {
          if (true_sel.ptr == (SelectionVector *)0x0) {
            if (count == 0) {
              local_4c0 = 0;
            }
            else {
              psVar58 = (sel.ptr)->sel_vector;
              lVar48 = *(long *)local_4a8;
              psVar34 = *(sel_t **)local_438;
              local_4c0 = 0;
              iVar35 = 0;
              do {
                iVar23 = iVar35;
                if (psVar58 != (sel_t *)0x0) {
                  iVar23 = (idx_t)psVar58[iVar35];
                }
                iVar29 = iVar35;
                if (lVar48 != 0) {
                  iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
                }
                iVar36 = iVar35;
                if (psVar34 != (sel_t *)0x0) {
                  iVar36 = (idx_t)psVar34[iVar35];
                }
                if (LStack_4a0.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar67 = false;
                }
                else {
                  bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                             super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                             ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) ==
                           0;
                }
                if (LStack_430.type_info_.internal.
                    super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                    (element_type *)0x0) {
                  bVar68 = true;
                }
                else {
                  bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                     ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f)
                           & 1) != 0;
                }
                if (!bVar67 && bVar68) {
                  piVar55 = (int *)(LStack_4a0._0_8_ + iVar29 * 0x10);
                  piVar44 = (int *)(LStack_430._0_8_ + iVar36 * 0x10);
                  lVar50 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
                  lVar54 = lVar50 % 0x1e;
                  lVar65 = (long)*piVar55 + lVar50 / 0x1e;
                  lVar51 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
                  lVar50 = lVar51 % 0x1e;
                  lVar51 = (long)*piVar44 + lVar51 / 0x1e;
                  if (lVar65 <= lVar51) {
                    if (lVar65 < lVar51) goto LAB_013d3485;
                    if (lVar54 <= lVar50) {
                      bVar68 = *(long *)(piVar44 + 2) % 86400000000 <
                               *(long *)(piVar55 + 2) % 86400000000 && lVar50 <= lVar54;
                      goto LAB_013d3388;
                    }
                  }
                }
                else {
LAB_013d3388:
                  if (!bVar68) {
LAB_013d3485:
                    (false_sel.ptr)->sel_vector[local_4c0] = (sel_t)iVar23;
                    local_4c0 = local_4c0 + 1;
                  }
                }
                iVar35 = iVar35 + 1;
              } while (count != iVar35);
            }
            goto LAB_013d4314;
          }
          if (count == 0) goto LAB_013d165d;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          iVar35 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              piVar44 = (int *)(LStack_4a0._0_8_ + iVar29 * 0x10);
              piVar55 = (int *)(LStack_430._0_8_ + iVar36 * 0x10);
              lVar50 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
              lVar54 = lVar50 % 0x1e;
              lVar65 = (long)*piVar44 + lVar50 / 0x1e;
              lVar51 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
              lVar50 = lVar51 % 0x1e;
              lVar51 = (long)*piVar55 + lVar51 / 0x1e;
              if (lVar65 <= lVar51) {
                if (lVar65 < lVar51) goto LAB_013d1630;
                if (lVar54 <= lVar50) {
                  bVar68 = *(long *)(piVar55 + 2) % 86400000000 <
                           *(long *)(piVar44 + 2) % 86400000000 && lVar50 <= lVar54;
                  goto LAB_013d1516;
                }
              }
LAB_013d1613:
              (true_sel.ptr)->sel_vector[(long)local_4d0] = (sel_t)iVar23;
              local_4d0 = (sel_t *)((long)local_4d0 + 1);
            }
            else {
LAB_013d1516:
              if (bVar68) goto LAB_013d1613;
            }
LAB_013d1630:
            iVar35 = iVar35 + 1;
          } while (count != iVar35);
        }
        else {
          if (count == 0) goto LAB_013d165d;
          psVar58 = (sel.ptr)->sel_vector;
          lVar48 = *(long *)local_4a8;
          psVar34 = *(sel_t **)local_438;
          local_3c8 = (sel_t *)0x0;
          iVar35 = 0;
          psVar59 = (sel_t *)0x0;
          do {
            iVar23 = iVar35;
            if (psVar58 != (sel_t *)0x0) {
              iVar23 = (idx_t)psVar58[iVar35];
            }
            iVar29 = iVar35;
            if (lVar48 != 0) {
              iVar29 = (idx_t)*(uint *)(lVar48 + iVar35 * 4);
            }
            iVar36 = iVar35;
            if (psVar34 != (sel_t *)0x0) {
              iVar36 = (idx_t)psVar34[iVar35];
            }
            if (LStack_4a0.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                         ._M_ptr + (iVar29 >> 6) * 8) >> (iVar29 & 0x3f) & 1) == 0;
            }
            if (LStack_430.type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
                (element_type *)0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                 ._M_ptr)->_vptr_ExtraTypeInfo)[iVar36 >> 6] >> (iVar36 & 0x3f) & 1)
                       != 0;
            }
            if (!bVar67 && bVar68) {
              piVar55 = (int *)(LStack_4a0._0_8_ + iVar29 * 0x10);
              piVar44 = (int *)(LStack_430._0_8_ + iVar36 * 0x10);
              lVar50 = (long)piVar55[1] + *(long *)(piVar55 + 2) / 86400000000;
              lVar54 = lVar50 % 0x1e;
              lVar65 = (long)*piVar55 + lVar50 / 0x1e;
              lVar51 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
              lVar50 = lVar51 % 0x1e;
              lVar51 = (long)*piVar44 + lVar51 / 0x1e;
              if (lVar65 <= lVar51) {
                if (lVar65 < lVar51) goto LAB_013cfb9a;
                if (lVar54 <= lVar50) {
                  bVar68 = *(long *)(piVar44 + 2) % 86400000000 <
                           *(long *)(piVar55 + 2) % 86400000000 && lVar50 <= lVar54;
                  goto LAB_013cfa86;
                }
              }
LAB_013cfb85:
              local_4d0 = (sel_t *)((long)psVar59 + 1);
              psVar57 = psVar59;
              oVar31.ptr = true_sel.ptr;
            }
            else {
LAB_013cfa86:
              if (bVar68) goto LAB_013cfb85;
LAB_013cfb9a:
              psVar57 = local_3c8;
              oVar31.ptr = false_sel.ptr;
              local_4d0 = psVar59;
              local_3c8 = (sel_t *)((long)local_3c8 + 1);
            }
            (oVar31.ptr)->sel_vector[(long)psVar57] = (sel_t)iVar23;
            iVar35 = iVar35 + 1;
            psVar59 = local_4d0;
          } while (count != iVar35);
        }
        if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
        }
        if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
        }
        if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
        }
        goto LAB_013d10a4;
      }
      pdVar11 = left->data;
      piVar44 = (int *)right->data;
      _local_4a8 = (undefined1  [16])0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
           (element_type *)0x0;
      LStack_4a0.type_info_.internal.
      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
      puVar5 = (right->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
      if ((puVar5 != (unsigned_long *)0x0) && ((*puVar5 & 1) == 0)) {
        local_288._0_8_ = 0x800;
        make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                  ((duckdb *)local_438,(unsigned_long *)&local_288);
        peVar18 = LStack_4a0.type_info_.internal.
                  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        auVar19 = local_438;
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)LStack_430._0_8_;
        _local_438 = (undefined1  [16])0x0;
        LStack_4a0._0_8_ = auVar19;
        if (peVar18 != (element_type *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)LStack_430._0_8_);
        }
        pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                            ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true> *)
                             (local_4a8 + 8));
        _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             (pTVar26->owned_data).
             super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
             super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>._M_t.
             super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
             super__Head_base<0UL,_unsigned_long_*,_false>;
        local_4a8 = (undefined1  [8])
                    _Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl;
        *(undefined8 *)_Var12.super__Head_base<0UL,_unsigned_long_*,_false>._M_head_impl =
             0xfffffffffffffffe;
      }
      FlatVector::VerifyFlatVector(left);
      local_488._M_pi =
           (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           LStack_4a0.type_info_.internal.
           super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if (false_sel.ptr == (SelectionVector *)0x0 || true_sel.ptr == (SelectionVector *)0x0) {
        if (true_sel.ptr == (SelectionVector *)0x0) {
          if (count == 0) goto LAB_013d108f;
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (false_sel.ptr)->sel_vector;
          plVar37 = (long *)(pdVar11 + 8);
          lVar48 = 0;
          uVar49 = 0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              lVar54 = (long)*(int *)((long)plVar37 + -4) + *plVar37 / 86400000000;
              lVar65 = (long)(int)plVar37[-1] + lVar54 / 0x1e;
              lVar50 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
              lVar51 = (long)*piVar44 + lVar50 / 0x1e;
              bVar68 = true;
              if (lVar65 <= lVar51) {
                if (lVar65 < lVar51) {
                  bVar68 = false;
                }
                else {
                  lVar54 = lVar54 % 0x1e;
                  lVar50 = lVar50 % 0x1e;
                  if (lVar54 <= lVar50) {
                    bVar68 = *(long *)(piVar44 + 2) % 86400000000 < *plVar37 % 86400000000 &&
                             lVar50 <= lVar54;
                  }
                }
              }
            }
            psVar34[lVar48] = (sel_t)uVar32;
            lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
            uVar49 = uVar49 + 1;
            plVar37 = plVar37 + 2;
          } while (count != uVar49);
          goto LAB_013d109a;
        }
        if (count != 0) {
          psVar58 = (sel.ptr)->sel_vector;
          puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
          psVar34 = (true_sel.ptr)->sel_vector;
          plVar37 = (long *)(pdVar11 + 8);
          uVar49 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            uVar32 = uVar49;
            if (psVar58 != (sel_t *)0x0) {
              uVar32 = (ulong)psVar58[uVar49];
            }
            if (puVar5 == (unsigned_long *)0x0) {
              bVar67 = false;
            }
            else {
              bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
            }
            if (local_4a8 == (undefined1  [8])0x0) {
              bVar68 = true;
            }
            else {
              bVar68 = (bool)(*(byte *)local_4a8 & 1);
            }
            if (!bVar67 && bVar68 == true) {
              lVar50 = (long)*(int *)((long)plVar37 + -4) + *plVar37 / 86400000000;
              lVar54 = (long)(int)plVar37[-1] + lVar50 / 0x1e;
              lVar48 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
              lVar51 = (long)*piVar44 + lVar48 / 0x1e;
              bVar68 = true;
              if (lVar54 <= lVar51) {
                if (lVar54 < lVar51) {
                  bVar68 = false;
                }
                else {
                  lVar50 = lVar50 % 0x1e;
                  lVar48 = lVar48 % 0x1e;
                  if (lVar50 <= lVar48) {
                    bVar68 = *(long *)(piVar44 + 2) % 86400000000 < *plVar37 % 86400000000 &&
                             lVar48 <= lVar50;
                  }
                }
              }
            }
            psVar34[(long)local_4d0] = (sel_t)uVar32;
            local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
            uVar49 = uVar49 + 1;
            plVar37 = plVar37 + 2;
          } while (count != uVar49);
          goto LAB_013d10a4;
        }
      }
      else if (count != 0) {
        psVar58 = (sel.ptr)->sel_vector;
        puVar5 = (left->validity).super_TemplatedValidityMask<unsigned_long>.validity_mask;
        local_3c8 = (true_sel.ptr)->sel_vector;
        psVar34 = (false_sel.ptr)->sel_vector;
        plVar37 = (long *)(pdVar11 + 8);
        lVar48 = 0;
        local_4d0 = (sel_t *)0x0;
        uVar49 = 0;
        do {
          uVar32 = uVar49;
          if (psVar58 != (sel_t *)0x0) {
            uVar32 = (ulong)psVar58[uVar49];
          }
          if (puVar5 == (unsigned_long *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (puVar5[uVar49 >> 6] >> (uVar49 & 0x3f) & 1) == 0;
          }
          if (local_4a8 == (undefined1  [8])0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = (bool)(*(byte *)local_4a8 & 1);
          }
          if (!bVar67 && bVar68 == true) {
            lVar54 = (long)*(int *)((long)plVar37 + -4) + *plVar37 / 86400000000;
            lVar51 = (long)(int)plVar37[-1] + lVar54 / 0x1e;
            lVar50 = (long)piVar44[1] + *(long *)(piVar44 + 2) / 86400000000;
            lVar65 = (long)*piVar44 + lVar50 / 0x1e;
            bVar68 = true;
            if (lVar51 <= lVar65) {
              if (lVar51 < lVar65) {
                bVar68 = false;
              }
              else {
                lVar54 = lVar54 % 0x1e;
                lVar50 = lVar50 % 0x1e;
                if (lVar54 <= lVar50) {
                  bVar68 = *(long *)(piVar44 + 2) % 86400000000 < *plVar37 % 86400000000 &&
                           lVar50 <= lVar54;
                }
              }
            }
          }
          local_3c8[(long)local_4d0] = (sel_t)uVar32;
          local_4d0 = (sel_t *)((long)local_4d0 + (ulong)bVar68);
          psVar34[lVar48] = (sel_t)uVar32;
          lVar48 = lVar48 + (ulong)(bVar68 ^ 1);
          uVar49 = uVar49 + 1;
          plVar37 = plVar37 + 2;
        } while (count != uVar49);
        goto LAB_013d10a4;
      }
    }
LAB_013ce350:
    local_4d0 = (sel_t *)0x0;
    local_488._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
         LStack_4a0.type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_013d10a4:
    if ((element_type *)local_488._M_pi != (element_type *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
      return (idx_t)local_4d0;
    }
    return (idx_t)local_4d0;
  case LIST:
  case STRUCT:
  case ARRAY:
    local_218.ptr = false_sel.ptr;
    local_210.ptr = true_sel.ptr;
    local_208.ptr = sel.ptr;
    if (sel.ptr == (SelectionVector *)0x0) {
      local_208.ptr = FlatVector::IncrementalSelectionVector();
    }
    SelectionVector::SelectionVector(&local_118,count);
    OptionalSelection::OptionalSelection(&local_198,&local_118);
    SelectionVector::SelectionVector(&local_130,count);
    OptionalSelection::OptionalSelection(&local_1b8,&local_130);
    SelectionVector::SelectionVector((SelectionVector *)(local_368 + 0x28),count);
    Vector::Vector(&local_100,left);
    Vector::Vector(&local_98,right);
    optional_ptr<const_duckdb::SelectionVector,_true>::CheckValid(&local_208);
    oVar47.ptr = local_208.ptr;
    local_200.sel = (SelectionVector *)null_mask.ptr;
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_4a8);
    UnifiedVectorFormat::UnifiedVectorFormat((UnifiedVectorFormat *)local_438);
    Vector::ToUnifiedFormat(&local_100,count,(UnifiedVectorFormat *)local_4a8);
    Vector::ToUnifiedFormat(&local_98,count,(UnifiedVectorFormat *)local_438);
    if (LStack_430.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0 &&
        LStack_4a0.type_info_.internal.
        super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
        (element_type *)0x0) {
      if (count == 0) {
        local_4b0 = 0;
        uVar49 = 0;
      }
      else {
        psVar58 = (oVar47.ptr)->sel_vector;
        local_4b0 = 0;
        iVar35 = 0;
        do {
          sVar45 = (sel_t)iVar35;
          if (psVar58 != (sel_t *)0x0) {
            sVar45 = psVar58[iVar35];
          }
          *(sel_t *)(local_368._40_8_ + iVar35 * 4) = sVar45;
          iVar35 = iVar35 + 1;
          uVar49 = count;
        } while (count != iVar35);
      }
    }
    else {
      SelectionVector::SelectionVector((SelectionVector *)&local_288,count);
      if (count == 0) {
        local_4b0 = 0;
        local_4d8.ptr = (ValidityMask *)0x0;
        uVar49 = 0;
      }
      else {
        local_4b0 = 0;
        uVar49 = 0;
        uVar32 = 0;
        local_4d8.ptr = (ValidityMask *)0x0;
        do {
          psVar58 = (oVar47.ptr)->sel_vector;
          uVar60 = uVar32;
          if (psVar58 != (sel_t *)0x0) {
            uVar60 = (ulong)psVar58[uVar32];
          }
          uVar30 = uVar32;
          if (*(long *)local_4a8 != 0) {
            uVar30 = (ulong)*(uint *)(*(long *)local_4a8 + uVar32 * 4);
          }
          uVar21 = uVar32;
          if (*(sel_t **)local_438 != (sel_t *)0x0) {
            uVar21 = (ulong)(*(sel_t **)local_438)[uVar32];
          }
          if (LStack_4a0.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar67 = false;
          }
          else {
            bVar67 = (*(ulong *)((long)LStack_4a0.type_info_.internal.
                                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                                       ._M_ptr + (uVar30 >> 6) * 8) >> (uVar30 & 0x3f) & 1) == 0;
          }
          if (LStack_430.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr ==
              (element_type *)0x0) {
            bVar68 = true;
          }
          else {
            bVar68 = ((ulong)(&(LStack_430.type_info_.internal.
                                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>
                               ._M_ptr)->_vptr_ExtraTypeInfo)[uVar21 >> 6] >> (uVar21 & 0x3f) & 1)
                     != 0;
          }
          sVar45 = (sel_t)uVar60;
          if ((bool)(bVar67 | bVar68 ^ 1U)) {
            if (local_200.sel != (SelectionVector *)0x0) {
              optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                        ((optional_ptr<duckdb::ValidityMask,_true> *)&local_200);
              pSVar1 = local_200.sel;
              if (((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                  validity_mask == (unsigned_long *)0x0) {
                local_178.sel = (SelectionVector *)local_200.sel[1].sel_vector;
                make_buffer<duckdb::TemplatedValidityData<unsigned_long>,unsigned_long&>
                          ((duckdb *)local_328,(unsigned_long *)&local_178);
                auVar19 = local_328;
                uVar17 = aLStack_320[0]._0_8_;
                _local_328 = (undefined1  [16])0x0;
                p_Var25 = (pSVar1->selection_data).internal.
                          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                          _M_refcount._M_pi;
                (pSVar1->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                     (element_type *)auVar19;
                (pSVar1->selection_data).internal.
                super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17;
                if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
                }
                if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_320[0]._0_8_ !=
                    (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                            ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)aLStack_320[0]._0_8_);
                }
                pTVar26 = shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>::operator->
                                    ((shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_true>
                                      *)&pSVar1->selection_data);
                ((TemplatedValidityMask<unsigned_long> *)&pSVar1->sel_vector)->validity_mask =
                     (unsigned_long *)
                     (pTVar26->owned_data).
                     super_unique_ptr<unsigned_long[],_std::default_delete<unsigned_long[]>_>._M_t.
                     super___uniq_ptr_impl<unsigned_long,_std::default_delete<unsigned_long[]>_>.
                     _M_t.
                     super__Tuple_impl<0UL,_unsigned_long_*,_std::default_delete<unsigned_long[]>_>.
                     super__Head_base<0UL,_unsigned_long_*,_false>;
              }
              bVar15 = (byte)uVar60 & 0x3f;
              puVar10 = ((TemplatedValidityMask<unsigned_long> *)&pSVar1->sel_vector)->validity_mask
                        + (uVar60 >> 6);
              *puVar10 = *puVar10 & (-2L << bVar15 | 0xfffffffffffffffeU >> 0x40 - bVar15);
            }
            if (bVar68) {
              if (local_198.sel != (SelectionVector *)0x0) {
                (local_198.sel)->sel_vector[local_4b0] = sVar45;
              }
              local_4b0 = local_4b0 + 1;
            }
            else {
              if (local_1b8.sel != (SelectionVector *)0x0) {
                (local_1b8.sel)->sel_vector[(long)local_4d8.ptr] = sVar45;
              }
              local_4d8.ptr = (ValidityMask *)((long)local_4d8.ptr + 1);
            }
          }
          else {
            *(sel_t *)(local_288._0_8_ + uVar49 * 4) = (sel_t)uVar32;
            *(sel_t *)(local_368._40_8_ + uVar49 * 4) = sVar45;
            uVar49 = uVar49 + 1;
          }
          uVar32 = uVar32 + 1;
        } while (count != uVar32);
      }
      pSVar1 = local_198.sel;
      if (local_198.sel != (SelectionVector *)0x0) {
        psVar58 = (local_198.sel)->sel_vector;
        p_Var25 = ((local_198.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_198.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
        }
        pSVar1->sel_vector = psVar58 + local_4b0;
      }
      pSVar1 = local_1b8.sel;
      if (local_1b8.sel != (SelectionVector *)0x0) {
        psVar58 = (local_1b8.sel)->sel_vector;
        p_Var25 = ((local_1b8.sel)->selection_data).internal.
                  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                  _M_pi;
        ((local_1b8.sel)->selection_data).internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
             (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
        if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
        }
        pSVar1->sel_vector = psVar58 + (long)local_4d8.ptr;
      }
      if (uVar49 < count && uVar49 != 0) {
        Vector::Slice(&local_100,(SelectionVector *)&local_288,uVar49);
        Vector::Slice(&local_98,(SelectionVector *)&local_288,uVar49);
      }
      if (local_288.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
          (element_type *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                   local_288.type.type_info_.internal.
                   super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
      }
    }
    if (local_3f8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3f8._M_pi);
    }
    if (local_418._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_418._M_pi);
    }
    if (local_468._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_468._M_pi);
    }
    if (local_488._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_488._M_pi);
    }
    PVar2 = (left->type).physical_type_;
    if (PVar2 == LIST) {
      local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                  (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
      if (uVar49 == 0) goto LAB_013c6435;
      SelectionVector::SelectionVector(&local_3a0,uVar49);
      SelectionVector::SelectionVector(&local_380,uVar49);
      pVVar22 = ListVector::GetEntry(&local_100);
      Vector::Vector((Vector *)local_4a8,pVVar22);
      pVVar22 = ListVector::GetEntry(&local_98);
      Vector::Vector((Vector *)local_438,pVVar22);
      iVar35 = ListVector::GetListSize(&local_100);
      Vector::Flatten((Vector *)local_4a8,iVar35);
      iVar35 = ListVector::GetListSize(&local_98);
      Vector::Flatten((Vector *)local_438,iVar35);
      Vector::Vector(&local_288,(Vector *)local_4a8,&local_3a0,uVar49);
      Vector::Vector((Vector *)local_328,(Vector *)local_438,&local_380,uVar49);
      UnifiedVectorFormat::UnifiedVectorFormat(&local_178);
      Vector::ToUnifiedFormat(&local_100,uVar49,&local_178);
      pdVar13 = local_178.data;
      UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
      Vector::ToUnifiedFormat(&local_98,uVar49,&local_200);
      pdVar11 = local_200.data;
      SelectionVector::SelectionVector(&local_3b8,uVar49);
      auVar16 = _DAT_01dd7b40;
      lVar48 = uVar49 - 1;
      auVar71._8_4_ = (int)lVar48;
      auVar71._0_8_ = lVar48;
      auVar71._12_4_ = (int)((ulong)lVar48 >> 0x20);
      uVar32 = 0;
      auVar71 = auVar71 ^ _DAT_01dd7b40;
      auVar73 = _DAT_01dd7b30;
      do {
        auVar74 = auVar73 ^ auVar16;
        if ((bool)(~(auVar74._4_4_ == auVar71._4_4_ && auVar71._0_4_ < auVar74._0_4_ ||
                    auVar71._4_4_ < auVar74._4_4_) & 1)) {
          local_3b8.sel_vector[uVar32] = (sel_t)uVar32;
        }
        if ((auVar74._12_4_ != auVar71._12_4_ || auVar74._8_4_ <= auVar71._8_4_) &&
            auVar74._12_4_ <= auVar71._12_4_) {
          local_3b8.sel_vector[uVar32 + 1] = (sel_t)uVar32 + 1;
        }
        uVar32 = uVar32 + 2;
        lVar48 = auVar73._8_8_;
        auVar73._0_8_ = auVar73._0_8_ + 2;
        auVar73._8_8_ = lVar48 + 2;
      } while ((uVar49 + 1 & 0xfffffffffffffffe) != uVar32);
      SelectionVector::SelectionVector(&local_2a0,uVar49);
      SelectionVector::SelectionVector(&local_2b8,uVar49);
      local_368._0_16_ = (undefined1  [16])0x0;
      local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_368._24_8_ = (element_type *)0x800;
      if (local_3c0.ptr == (ValidityMask *)0x0) {
        oVar33.ptr = (ValidityMask *)0x0;
      }
      else {
        optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
        peVar24 = (element_type *)ValidityMask::Capacity(local_3c0.ptr);
        uVar17 = local_368._16_8_;
        local_368._0_16_ = (undefined1  [16])0x0;
        local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
        }
        oVar33.ptr = (ValidityMask *)local_368;
        local_368._24_8_ = peVar24;
      }
      local_4d0 = (sel_t *)0x0;
      uVar32 = 0;
      do {
        pSVar1 = local_198.sel;
        psVar58 = (local_178.sel)->sel_vector;
        uVar60 = 0;
        do {
          uVar30 = uVar60;
          if (local_3b8.sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)local_3b8.sel_vector[uVar60];
          }
          if (psVar58 != (sel_t *)0x0) {
            uVar30 = (ulong)psVar58[uVar30];
          }
          iVar43 = (int)uVar32;
          local_3a0.sel_vector[uVar60] = *(int *)((long)local_178.data + uVar30 * 2 * 8) + iVar43;
          uVar60 = uVar60 + 1;
        } while (uVar49 != uVar60);
        puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                 validity_mask;
        uVar60 = 0;
        do {
          uVar30 = uVar60;
          if (local_3b8.sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)local_3b8.sel_vector[uVar60];
          }
          if (puVar5 != (unsigned_long *)0x0) {
            uVar30 = (ulong)*(uint *)((long)puVar5 + uVar30 * 4);
          }
          *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                          validity_mask + uVar60 * 4) =
               *(int *)(local_200.data + uVar30 * 0x10) + iVar43;
          uVar60 = uVar60 + 1;
        } while (uVar49 != uVar60);
        puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                 validity_mask;
        uVar60 = 0;
        local_4c0 = 0;
        lVar48 = 0;
        lVar50 = 0;
        do {
          uVar30 = uVar60;
          if (local_3b8.sel_vector != (sel_t *)0x0) {
            uVar30 = (ulong)local_3b8.sel_vector[uVar60];
          }
          uVar21 = uVar30;
          if (psVar58 != (sel_t *)0x0) {
            uVar21 = (ulong)psVar58[uVar30];
          }
          uVar53 = uVar30;
          if (puVar5 != (unsigned_long *)0x0) {
            uVar53 = (ulong)*(uint *)((long)puVar5 + uVar30 * 4);
          }
          if ((*(ulong *)((long)pdVar13 + (uVar21 * 2 + 1) * 8) == uVar32) ||
             (*(ulong *)(pdVar11 + uVar53 * 0x10 + 8) == uVar32)) {
            if (local_368._40_8_ != 0) {
              uVar30 = (ulong)*(uint *)(local_368._40_8_ + uVar30 * 4);
            }
            if (*(ulong *)(pdVar11 + uVar53 * 0x10 + 8) <
                *(ulong *)((long)pdVar13 + (uVar21 * 2 + 1) * 8)) {
              if (local_198.sel != (SelectionVector *)0x0) {
                (local_198.sel)->sel_vector[lVar48] = (sel_t)uVar30;
              }
              lVar48 = lVar48 + 1;
            }
            else {
              if (local_1b8.sel != (SelectionVector *)0x0) {
                (local_1b8.sel)->sel_vector[lVar50] = (sel_t)uVar30;
              }
              lVar50 = lVar50 + 1;
            }
          }
          else {
            local_2a0.sel_vector[local_4c0] = (sel_t)uVar30;
            local_4c0 = local_4c0 + 1;
          }
          uVar60 = uVar60 + 1;
        } while (uVar49 != uVar60);
        if (local_198.sel != (SelectionVector *)0x0) {
          psVar58 = (local_198.sel)->sel_vector;
          p_Var25 = ((local_198.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_198.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          pSVar1->sel_vector = psVar58 + lVar48;
        }
        pSVar1 = local_1b8.sel;
        if (local_1b8.sel != (SelectionVector *)0x0) {
          psVar58 = (local_1b8.sel)->sel_vector;
          p_Var25 = ((local_1b8.sel)->selection_data).internal.
                    super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount._M_pi;
          ((local_1b8.sel)->selection_data).internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
               (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
          if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
          }
          pSVar1->sel_vector = psVar58 + lVar50;
        }
        if (local_4c0 < uVar49) {
          if (local_4c0 != 0) {
            uVar49 = 0;
            do {
              sVar45 = (sel_t)uVar49;
              if (local_2a0.sel_vector != (sel_t *)0x0) {
                sVar45 = local_2a0.sel_vector[uVar49];
              }
              local_3b8.sel_vector[uVar49] = sVar45;
              uVar49 = uVar49 + 1;
            } while (local_4c0 != uVar49);
          }
          if (local_4c0 != 0) {
            psVar58 = (local_178.sel)->sel_vector;
            uVar49 = 0;
            do {
              uVar60 = uVar49;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3b8.sel_vector[uVar49];
              }
              if (psVar58 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar58[uVar60];
              }
              local_3a0.sel_vector[uVar49] =
                   *(int *)((long)local_178.data + uVar60 * 2 * 8) + iVar43;
              uVar49 = uVar49 + 1;
            } while (local_4c0 != uVar49);
          }
          uVar49 = local_4c0;
          if (local_4c0 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar60 = 0;
            do {
              uVar30 = uVar60;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)local_3b8.sel_vector[uVar60];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar30 = (ulong)*(uint *)((long)puVar5 + uVar30 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                              validity_mask + uVar60 * 4) =
                   *(int *)(local_200.data + uVar30 * 0x10) + iVar43;
              uVar60 = uVar60 + 1;
            } while (local_4c0 != uVar60);
          }
        }
        iVar35 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                           (&local_288,(Vector *)local_328,&local_3b8,uVar49,&local_2a0,&local_2b8,
                            oVar33);
        ExtractNestedMask(&local_3b8,uVar49,(SelectionVector *)(local_368 + 0x28),oVar33.ptr,
                          local_3c0);
        local_4d0 = (sel_t *)((long)local_4d0 + lVar48);
        if (iVar35 != 0) {
          oVar31.ptr = &local_2a0;
          if (uVar49 == iVar35) {
            oVar31.ptr = &local_3b8;
          }
          ExtractNestedSelection(oVar31.ptr,iVar35,(SelectionVector *)(local_368 + 0x28),&local_198)
          ;
          uVar49 = uVar49 - iVar35;
          if (uVar49 != 0) {
            uVar60 = 0;
            do {
              sVar45 = (sel_t)uVar60;
              if (local_2b8.sel_vector != (sel_t *)0x0) {
                sVar45 = local_2b8.sel_vector[uVar60];
              }
              local_3b8.sel_vector[uVar60] = sVar45;
              uVar60 = uVar60 + 1;
            } while (uVar49 != uVar60);
          }
          if (uVar49 != 0) {
            psVar58 = (local_178.sel)->sel_vector;
            uVar60 = 0;
            do {
              uVar30 = uVar60;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)local_3b8.sel_vector[uVar60];
              }
              if (psVar58 != (sel_t *)0x0) {
                uVar30 = (ulong)psVar58[uVar30];
              }
              local_3a0.sel_vector[uVar60] =
                   *(int *)((long)local_178.data + uVar30 * 2 * 8) + iVar43;
              uVar60 = uVar60 + 1;
            } while (uVar49 != uVar60);
          }
          local_4d0 = (sel_t *)((long)local_4d0 + iVar35);
          if (uVar49 != 0) {
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar60 = 0;
            do {
              uVar30 = uVar60;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)local_3b8.sel_vector[uVar60];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar30 = (ulong)*(uint *)((long)puVar5 + uVar30 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                              validity_mask + uVar60 * 4) =
                   *(int *)(local_200.data + uVar30 * 0x10) + iVar43;
              uVar60 = uVar60 + 1;
            } while (uVar49 != uVar60);
          }
        }
        iVar35 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                           (&local_288,(Vector *)local_328,&local_3b8,uVar49,&local_2b8,&local_2a0,
                            oVar33);
        ExtractNestedMask(&local_3b8,uVar49,(SelectionVector *)(local_368 + 0x28),oVar33.ptr,
                          local_3c0);
        uVar49 = uVar49 - iVar35;
        oVar47.ptr = &local_2b8;
        if (uVar49 == 0) {
          oVar47.ptr = &local_3b8;
        }
        ExtractNestedSelection(oVar47.ptr,iVar35,(SelectionVector *)(local_368 + 0x28),&local_1b8);
        if (iVar35 != 0 && uVar49 != 0) {
          uVar60 = 0;
          do {
            sVar45 = (sel_t)uVar60;
            if (local_2a0.sel_vector != (sel_t *)0x0) {
              sVar45 = local_2a0.sel_vector[uVar60];
            }
            local_3b8.sel_vector[uVar60] = sVar45;
            uVar60 = uVar60 + 1;
          } while (uVar49 != uVar60);
        }
        uVar32 = uVar32 + 1;
      } while (uVar49 != 0);
LAB_013ca2b8:
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_);
      }
      if (local_2b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2b8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_2a0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_2a0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_3b8.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3b8.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_178.owned_sel.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.owned_sel.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      if (local_2c8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2c8._M_pi);
      }
      if (local_2d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2d8._M_pi);
      }
      if (local_2f0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_2f0._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_328 + 8));
      if (local_288.auxiliary.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.auxiliary.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_288.buffer.internal.
          super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.buffer.internal.
                   super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                   _M_pi);
      }
      if (local_288.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
          super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
          ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_288.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                   internal.
                   super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)((long)&local_288 + 8));
      if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
      }
      if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
      }
      if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_438 + 8));
      if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
      }
      if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
      }
      if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
      }
      LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
      if (local_380.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_380.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
      if (local_3a0.selection_data.internal.
          super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  (local_3a0.selection_data.internal.
                   super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount
                   ._M_pi);
      }
    }
    else {
      if (PVar2 == STRUCT) {
        local_380.sel_vector = (sel_t *)null_mask.ptr;
        if (uVar49 != 0) {
          _local_328 = (undefined1  [16])0x0;
          aLStack_320[0].type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_178.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask =
               (unsigned_long *)0x0;
          local_178.sel = (SelectionVector *)0x0;
          local_178.data = (data_ptr_t)0x0;
          this = StructVector::GetEntries(&local_100);
          this_00 = StructVector::GetEntries(&local_98);
          SelectionVector::SelectionVector((SelectionVector *)&local_200,uVar49);
          auVar16 = _DAT_01dd7b40;
          lVar48 = uVar49 - 1;
          auVar70._8_4_ = (int)lVar48;
          auVar70._0_8_ = lVar48;
          auVar70._12_4_ = (int)((ulong)lVar48 >> 0x20);
          uVar32 = 0;
          auVar70 = auVar70 ^ _DAT_01dd7b40;
          auVar74 = _DAT_01dd7b30;
          do {
            auVar73 = auVar74 ^ auVar16;
            if ((bool)(~(auVar73._4_4_ == auVar70._4_4_ && auVar70._0_4_ < auVar73._0_4_ ||
                        auVar70._4_4_ < auVar73._4_4_) & 1)) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar32 * 4) = (int)uVar32;
            }
            if ((auVar73._12_4_ != auVar70._12_4_ || auVar73._8_4_ <= auVar70._8_4_) &&
                auVar73._12_4_ <= auVar70._12_4_) {
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                              ->validity_mask + uVar32 * 4 + 4) = (int)uVar32 + 1;
            }
            uVar32 = uVar32 + 2;
            lVar48 = auVar74._8_8_;
            auVar74._0_8_ = auVar74._0_8_ + 2;
            auVar74._8_8_ = lVar48 + 2;
          } while ((uVar49 + 1 & 0xfffffffffffffffe) != uVar32);
          SelectionVector::SelectionVector((SelectionVector *)local_368,uVar49);
          SelectionVector::SelectionVector(&local_3a0,uVar49);
          local_288.vector_type = FLAT_VECTOR;
          local_288._1_7_ = 0;
          local_288.type.id_ = INVALID;
          local_288.type.physical_type_ = ~INVALID;
          local_288.type._2_6_ = 0;
          local_288.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
               (element_type *)0x0;
          local_288.type.type_info_.internal.
          super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
               (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x800;
          if ((ValidityMask *)local_380.sel_vector == (ValidityMask *)0x0) {
            oVar33.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid
                      ((optional_ptr<duckdb::ValidityMask,_true> *)&local_380);
            p_Var25 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                      ValidityMask::Capacity((ValidityMask *)local_380.sel_vector);
            peVar18 = local_288.type.type_info_.internal.
                      super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
            local_288.vector_type = FLAT_VECTOR;
            local_288._1_7_ = 0;
            local_288.type.id_ = INVALID;
            local_288.type.physical_type_ = ~INVALID;
            local_288.type._2_6_ = 0;
            local_288.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
                 (element_type *)0x0;
            if (peVar18 != (element_type *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)peVar18);
            }
            oVar33.ptr = (ValidityMask *)&local_288;
            local_288.type.type_info_.internal.
            super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi
                 = p_Var25;
          }
          if ((this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_finish ==
              (this->
              super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ).
              super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
              ._M_impl.super__Vector_impl_data._M_start) {
            local_4d0 = (sel_t *)0x0;
          }
          else {
            __n = 0;
            local_4d0 = (sel_t *)0x0;
            iVar35 = uVar49;
            do {
              pvVar27 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this,__n);
              pVVar28 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar27);
              Vector::Vector((Vector *)local_4a8,pVVar28);
              Vector::Flatten((Vector *)local_4a8,uVar49);
              Vector::Slice((Vector *)local_4a8,(SelectionVector *)&local_200,iVar35);
              pvVar27 = vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_true>
                        ::operator[](this_00,__n);
              pVVar28 = unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>::
                        operator*(pvVar27);
              Vector::Vector((Vector *)local_438,pVVar28);
              Vector::Flatten((Vector *)local_438,uVar49);
              Vector::Slice((Vector *)local_438,(SelectionVector *)&local_200,iVar35);
              iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                 ((Vector *)local_4a8,(Vector *)local_438,
                                  (SelectionVector *)&local_200,iVar35,(SelectionVector *)local_368,
                                  &local_3a0,oVar33);
              ExtractNestedMask((SelectionVector *)&local_200,iVar35,
                                (SelectionVector *)(local_368 + 0x28),oVar33.ptr,
                                (optional_ptr<duckdb::ValidityMask,_true>)local_380.sel_vector);
              if (iVar23 != 0) {
                slice_sel_00 = (UnifiedVectorFormat *)local_368;
                if (iVar35 == iVar23) {
                  slice_sel_00 = &local_200;
                }
                ExtractNestedSelection
                          ((SelectionVector *)slice_sel_00,iVar23,
                           (SelectionVector *)(local_368 + 0x28),&local_198);
                iVar35 = iVar35 - iVar23;
                if (iVar35 != 0) {
                  iVar29 = 0;
                  do {
                    sVar45 = (sel_t)iVar29;
                    if (local_3a0.sel_vector != (sel_t *)0x0) {
                      sVar45 = local_3a0.sel_vector[iVar29];
                    }
                    *(sel_t *)((long)&((TemplatedValidityMask<unsigned_long> *)
                                      &(local_200.sel)->sel_vector)->validity_mask + iVar29 * 4) =
                         sVar45;
                    iVar29 = iVar29 + 1;
                  } while (iVar35 != iVar29);
                }
                local_4d0 = (sel_t *)((long)local_4d0 + iVar23);
              }
              if (__n == ((long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_finish -
                          (long)(this->
                                super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ).
                                super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                ._M_impl.super__Vector_impl_data._M_start >> 3) - 1U) {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                                   ((Vector *)local_4a8,(Vector *)local_438,
                                    (SelectionVector *)&local_200,iVar35,
                                    (SelectionVector *)local_368,&local_3a0,oVar33);
                pSVar1 = (SelectionVector *)(local_368 + 0x28);
                ExtractNestedMask((SelectionVector *)&local_200,iVar35,pSVar1,oVar33.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_380.sel_vector);
                oVar47.ptr = (SelectionVector *)local_368;
                if (iVar35 - iVar23 == 0) {
                  oVar47.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection(oVar47.ptr,iVar23,pSVar1,&local_198);
                oVar47.ptr = &local_3a0;
                if (iVar23 == 0) {
                  oVar47.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection(oVar47.ptr,iVar35 - iVar23,pSVar1,&local_1b8);
                local_4d0 = (sel_t *)((long)local_4d0 + iVar23);
              }
              else {
                iVar23 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                                   ((Vector *)local_4a8,(Vector *)local_438,
                                    (SelectionVector *)&local_200,iVar35,&local_3a0,
                                    (SelectionVector *)local_368,oVar33);
                ExtractNestedMask((SelectionVector *)&local_200,iVar35,
                                  (SelectionVector *)(local_368 + 0x28),oVar33.ptr,
                                  (optional_ptr<duckdb::ValidityMask,_true>)local_380.sel_vector);
                iVar35 = iVar35 - iVar23;
                oVar47.ptr = &local_3a0;
                if (iVar35 == 0) {
                  oVar47.ptr = (SelectionVector *)&local_200;
                }
                ExtractNestedSelection
                          (oVar47.ptr,iVar23,(SelectionVector *)(local_368 + 0x28),&local_1b8);
                if (iVar23 != 0 && iVar35 != 0) {
                  iVar23 = 0;
                  do {
                    uVar46 = (undefined4)iVar23;
                    if ((SelectionVector *)local_368._0_8_ != (SelectionVector *)0x0) {
                      uVar46 = *(undefined4 *)((long)(sel_t **)local_368._0_8_ + iVar23 * 4);
                    }
                    *(undefined4 *)
                     ((long)&((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)
                             ->validity_mask + iVar23 * 4) = uVar46;
                    iVar23 = iVar23 + 1;
                  } while (iVar35 != iVar23);
                }
              }
              if (local_3d8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3d8._M_pi);
              }
              if (local_3e8._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_3e8._M_pi);
              }
              if (local_400._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_400._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_438 + 8));
              if (local_448._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_448._M_pi);
              }
              if (local_458._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_458._M_pi);
              }
              if (local_470._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_470._M_pi);
              }
              LogicalType::~LogicalType((LogicalType *)(local_4a8 + 8));
              __n = __n + 1;
            } while (__n < (ulong)((long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_finish -
                                   (long)(this->
                                         super_vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ).
                                         super__Vector_base<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                                         ._M_impl.super__Vector_impl_data._M_start >> 3));
          }
          if (local_288.type.type_info_.internal.
              super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr !=
              (element_type *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_288.type.type_info_.internal.
                       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr)
            ;
          }
          if (local_3a0.selection_data.internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
              _M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      (local_3a0.selection_data.internal.
                       super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                       _M_refcount._M_pi);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_ !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_368._16_8_);
          }
          if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
              local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask !=
              (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
            ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                      ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
                       local_200.validity.super_TemplatedValidityMask<unsigned_long>.validity_mask);
          }
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)&local_178);
          ::std::
          vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
          ::~vector((vector<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>,_std::allocator<duckdb::unique_ptr<duckdb::Vector,_std::default_delete<duckdb::Vector>,_true>_>_>
                     *)local_328);
          goto LAB_013ca47a;
        }
      }
      else {
        if (PVar2 != ARRAY) {
          this_01 = (NotImplementedException *)__cxa_allocate_exception(0x10);
          local_4a8 = (undefined1  [8])&LStack_4a0.type_info_;
          ::std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_4a8,"Unimplemented type for DISTINCT","");
          NotImplementedException::NotImplementedException(this_01,(string *)local_4a8);
          __cxa_throw(this_01,&NotImplementedException::typeinfo,
                      ::std::runtime_error::~runtime_error);
        }
        local_3c0 = (optional_ptr<duckdb::ValidityMask,_true>)
                    (optional_ptr<duckdb::ValidityMask,_true>)null_mask.ptr;
        if (uVar49 != 0) {
          iVar35 = ArrayType::GetSize(&local_100.type);
          SelectionVector::SelectionVector(&local_3a0,uVar49);
          SelectionVector::SelectionVector(&local_380,uVar49);
          pVVar22 = ArrayVector::GetEntry(&local_100);
          Vector::Vector((Vector *)local_4a8,pVVar22);
          pVVar22 = ArrayVector::GetEntry(&local_98);
          Vector::Vector((Vector *)local_438,pVVar22);
          iVar23 = ArrayVector::GetTotalSize(&local_100);
          Vector::Flatten((Vector *)local_4a8,iVar23);
          iVar23 = ArrayVector::GetTotalSize(&local_98);
          Vector::Flatten((Vector *)local_438,iVar23);
          Vector::Vector(&local_288,(Vector *)local_4a8,&local_3a0,uVar49);
          Vector::Vector((Vector *)local_328,(Vector *)local_438,&local_380,uVar49);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_178);
          Vector::ToUnifiedFormat(&local_100,uVar49,&local_178);
          UnifiedVectorFormat::UnifiedVectorFormat(&local_200);
          Vector::ToUnifiedFormat(&local_98,uVar49,&local_200);
          SelectionVector::SelectionVector(&local_3b8,uVar49);
          auVar16 = _DAT_01dd7b40;
          lVar48 = uVar49 - 1;
          auVar69._8_4_ = (int)lVar48;
          auVar69._0_8_ = lVar48;
          auVar69._12_4_ = (int)((ulong)lVar48 >> 0x20);
          uVar32 = 0;
          auVar69 = auVar69 ^ _DAT_01dd7b40;
          auVar72 = _DAT_01dd7b30;
          do {
            auVar73 = auVar72 ^ auVar16;
            if ((bool)(~(auVar73._4_4_ == auVar69._4_4_ && auVar69._0_4_ < auVar73._0_4_ ||
                        auVar69._4_4_ < auVar73._4_4_) & 1)) {
              local_3b8.sel_vector[uVar32] = (sel_t)uVar32;
            }
            if ((auVar73._12_4_ != auVar69._12_4_ || auVar73._8_4_ <= auVar69._8_4_) &&
                auVar73._12_4_ <= auVar69._12_4_) {
              local_3b8.sel_vector[uVar32 + 1] = (sel_t)uVar32 + 1;
            }
            uVar32 = uVar32 + 2;
            lVar48 = auVar72._8_8_;
            auVar72._0_8_ = auVar72._0_8_ + 2;
            auVar72._8_8_ = lVar48 + 2;
          } while ((uVar49 + 1 & 0xfffffffffffffffe) != uVar32);
          SelectionVector::SelectionVector(&local_2a0,uVar49);
          SelectionVector::SelectionVector(&local_2b8,uVar49);
          local_368._0_16_ = (undefined1  [16])0x0;
          local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
          local_368._24_8_ = (element_type *)0x800;
          if (local_3c0.ptr == (ValidityMask *)0x0) {
            local_4d8.ptr = (ValidityMask *)0x0;
          }
          else {
            optional_ptr<duckdb::ValidityMask,_true>::CheckValid(&local_3c0);
            peVar24 = (element_type *)ValidityMask::Capacity(local_3c0.ptr);
            uVar17 = local_368._16_8_;
            local_368._0_16_ = (undefined1  [16])0x0;
            local_368._16_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
            if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17 !=
                (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
              ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                        ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)uVar17);
            }
            local_4d8.ptr = (ValidityMask *)local_368;
            local_368._24_8_ = peVar24;
          }
          iVar23 = 0;
          local_4d0 = (sel_t *)0x0;
          do {
            pSVar1 = local_198.sel;
            psVar58 = (local_178.sel)->sel_vector;
            uVar32 = 0;
            do {
              uVar60 = uVar32;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3b8.sel_vector[uVar32];
              }
              if (psVar58 != (sel_t *)0x0) {
                uVar60 = (ulong)psVar58[uVar60];
              }
              iVar56 = (int)iVar35;
              iVar43 = (int)iVar23;
              local_3a0.sel_vector[uVar32] = (int)uVar60 * iVar56 + iVar43;
              uVar32 = uVar32 + 1;
            } while (uVar49 != uVar32);
            puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                     validity_mask;
            uVar32 = 0;
            do {
              uVar60 = uVar32;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar60 = (ulong)local_3b8.sel_vector[uVar32];
              }
              if (puVar5 != (unsigned_long *)0x0) {
                uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
              }
              *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                              validity_mask + uVar32 * 4) = (int)uVar60 * iVar56 + iVar43;
              uVar32 = uVar32 + 1;
            } while (uVar49 != uVar32);
            uVar32 = 0;
            uVar60 = 0;
            lVar48 = 0;
            do {
              uVar30 = uVar32;
              if (local_3b8.sel_vector != (sel_t *)0x0) {
                uVar30 = (ulong)local_3b8.sel_vector[uVar32];
              }
              if (iVar35 == iVar23) {
                if (local_368._40_8_ != 0) {
                  uVar30 = (ulong)*(uint *)(local_368._40_8_ + uVar30 * 4);
                }
                if (local_1b8.sel != (SelectionVector *)0x0) {
                  (local_1b8.sel)->sel_vector[lVar48] = (sel_t)uVar30;
                }
                lVar48 = lVar48 + 1;
              }
              else {
                local_2a0.sel_vector[uVar60] = (sel_t)uVar30;
                uVar60 = uVar60 + 1;
              }
              uVar32 = uVar32 + 1;
            } while (uVar49 != uVar32);
            if (local_198.sel != (SelectionVector *)0x0) {
              psVar58 = (local_198.sel)->sel_vector;
              p_Var25 = ((local_198.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_198.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
              }
              pSVar1->sel_vector = psVar58;
            }
            pSVar1 = local_1b8.sel;
            if (local_1b8.sel != (SelectionVector *)0x0) {
              psVar58 = (local_1b8.sel)->sel_vector;
              p_Var25 = ((local_1b8.sel)->selection_data).internal.
                        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>.
                        _M_refcount._M_pi;
              ((local_1b8.sel)->selection_data).internal.
              super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2> =
                   (__shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>)0x0;
              if (p_Var25 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
                ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var25);
              }
              pSVar1->sel_vector = psVar58 + lVar48;
            }
            if ((uVar60 < uVar49) && (uVar49 = uVar60, uVar60 != 0)) {
              uVar32 = 0;
              do {
                sVar45 = (sel_t)uVar32;
                if (local_2a0.sel_vector != (sel_t *)0x0) {
                  sVar45 = local_2a0.sel_vector[uVar32];
                }
                local_3b8.sel_vector[uVar32] = sVar45;
                uVar32 = uVar32 + 1;
              } while (uVar60 != uVar32);
              psVar58 = (local_178.sel)->sel_vector;
              uVar32 = 0;
              do {
                uVar30 = uVar32;
                if (local_3b8.sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)local_3b8.sel_vector[uVar32];
                }
                if (psVar58 != (sel_t *)0x0) {
                  uVar30 = (ulong)psVar58[uVar30];
                }
                local_3a0.sel_vector[uVar32] = (int)uVar30 * iVar56 + iVar43;
                uVar32 = uVar32 + 1;
              } while (uVar60 != uVar32);
              puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                       validity_mask;
              uVar32 = 0;
              do {
                uVar30 = uVar32;
                if (local_3b8.sel_vector != (sel_t *)0x0) {
                  uVar30 = (ulong)local_3b8.sel_vector[uVar32];
                }
                if (puVar5 != (unsigned_long *)0x0) {
                  uVar30 = (ulong)*(uint *)((long)puVar5 + uVar30 * 4);
                }
                *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                                validity_mask + uVar32 * 4) = (int)uVar30 * iVar56 + iVar43;
                uVar32 = uVar32 + 1;
              } while (uVar60 != uVar32);
            }
            iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctGreaterThan>
                               (&local_288,(Vector *)local_328,&local_3b8,uVar49,&local_2a0,
                                &local_2b8,local_4d8);
            ExtractNestedMask(&local_3b8,uVar49,(SelectionVector *)(local_368 + 0x28),local_4d8.ptr,
                              local_3c0);
            if (iVar29 != 0) {
              oVar31.ptr = &local_2a0;
              if (uVar49 == iVar29) {
                oVar31.ptr = &local_3b8;
              }
              ExtractNestedSelection
                        (oVar31.ptr,iVar29,(SelectionVector *)(local_368 + 0x28),&local_198);
              local_4d0 = (sel_t *)((long)local_4d0 + iVar29);
              uVar49 = uVar49 - iVar29;
              if (uVar49 != 0) {
                uVar32 = 0;
                do {
                  sVar45 = (sel_t)uVar32;
                  if (local_2b8.sel_vector != (sel_t *)0x0) {
                    sVar45 = local_2b8.sel_vector[uVar32];
                  }
                  local_3b8.sel_vector[uVar32] = sVar45;
                  uVar32 = uVar32 + 1;
                } while (uVar49 != uVar32);
                psVar58 = (local_178.sel)->sel_vector;
                uVar32 = 0;
                do {
                  uVar60 = uVar32;
                  if (local_3b8.sel_vector != (sel_t *)0x0) {
                    uVar60 = (ulong)local_3b8.sel_vector[uVar32];
                  }
                  if (psVar58 != (sel_t *)0x0) {
                    uVar60 = (ulong)psVar58[uVar60];
                  }
                  local_3a0.sel_vector[uVar32] = (int)uVar60 * iVar56 + iVar43;
                  uVar32 = uVar32 + 1;
                } while (uVar49 != uVar32);
                puVar5 = ((TemplatedValidityMask<unsigned_long> *)&(local_200.sel)->sel_vector)->
                         validity_mask;
                uVar32 = 0;
                do {
                  uVar60 = uVar32;
                  if (local_3b8.sel_vector != (sel_t *)0x0) {
                    uVar60 = (ulong)local_3b8.sel_vector[uVar32];
                  }
                  if (puVar5 != (unsigned_long *)0x0) {
                    uVar60 = (ulong)*(uint *)((long)puVar5 + uVar60 * 4);
                  }
                  *(int *)((long)&((TemplatedValidityMask<unsigned_long> *)local_380.sel_vector)->
                                  validity_mask + uVar32 * 4) = (int)uVar60 * iVar56 + iVar43;
                  uVar32 = uVar32 + 1;
                } while (uVar49 != uVar32);
              }
            }
            iVar29 = TemplatedDistinctSelectOperation<duckdb::DistinctFrom>
                               (&local_288,(Vector *)local_328,&local_3b8,uVar49,&local_2b8,
                                &local_2a0,local_3c0);
            ExtractNestedMask(&local_3b8,uVar49,(SelectionVector *)(local_368 + 0x28),local_4d8.ptr,
                              local_3c0);
            uVar49 = uVar49 - iVar29;
            oVar47.ptr = &local_2b8;
            if (uVar49 == 0) {
              oVar47.ptr = &local_3b8;
            }
            ExtractNestedSelection
                      (oVar47.ptr,iVar29,(SelectionVector *)(local_368 + 0x28),&local_1b8);
            if (iVar29 != 0 && uVar49 != 0) {
              uVar32 = 0;
              do {
                uVar60 = uVar32;
                if (local_2a0.sel_vector != (sel_t *)0x0) {
                  uVar60 = (ulong)local_2a0.sel_vector[uVar32];
                }
                local_3b8.sel_vector[uVar32] = (sel_t)uVar60;
                uVar32 = uVar32 + 1;
              } while (uVar49 != uVar32);
            }
            iVar23 = iVar23 + 1;
          } while (uVar49 != 0);
          goto LAB_013ca2b8;
        }
      }
LAB_013c6435:
      local_4d0 = (sel_t *)0x0;
    }
LAB_013ca47a:
    local_4d0 = (sel_t *)((long)local_4d0 + local_4b0);
    if ((local_210.ptr != (SelectionVector *)0x0) &&
       (optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_210),
       local_4d0 != (sel_t *)0x0)) {
      psVar58 = (local_210.ptr)->sel_vector;
      psVar34 = (sel_t *)0x0;
      do {
        sVar45 = (sel_t)psVar34;
        if (local_118.sel_vector != (sel_t *)0x0) {
          sVar45 = local_118.sel_vector[(long)psVar34];
        }
        psVar58[(long)psVar34] = sVar45;
        psVar34 = (sel_t *)((long)psVar34 + 1);
      } while (local_4d0 != psVar34);
    }
    if (local_218.ptr != (SelectionVector *)0x0) {
      optional_ptr<duckdb::SelectionVector,_true>::CheckValid(&local_218);
      if ((sel_t *)count != local_4d0) {
        psVar58 = (local_218.ptr)->sel_vector;
        lVar48 = 0;
        do {
          sVar45 = (sel_t)lVar48;
          if (local_130.sel_vector != (sel_t *)0x0) {
            sVar45 = local_130.sel_vector[lVar48];
          }
          psVar58[lVar48] = sVar45;
          lVar48 = lVar48 + 1;
        } while (count - (long)local_4d0 != lVar48);
      }
    }
    if (local_98.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_98.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal
                 .
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_98.type);
    if (local_100.auxiliary.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.auxiliary.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.buffer.internal.
        super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.buffer.internal.
                 super___shared_ptr<duckdb::VectorBuffer,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.internal.
        super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_100.validity.super_TemplatedValidityMask<unsigned_long>.validity_data.
                 internal.
                 super___shared_ptr<duckdb::TemplatedValidityData<unsigned_long>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi);
    }
    LogicalType::~LogicalType(&local_100.type);
    if (local_330 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_330);
    }
    if (local_1b8.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_1b8.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_130.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_130.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    if (local_198.vec.selection_data.internal.
        super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                (local_198.vec.selection_data.internal.
                 super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                 _M_pi);
    }
    goto LAB_013d117e;
  }
LAB_013ce416:
  local_4d0 = (sel_t *)0x0;
  local_118.selection_data.internal.
  super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi =
       (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
       LStack_4a0.type_info_.internal.
       super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
LAB_013d117e:
  if ((element_type *)
      local_118.selection_data.internal.
      super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi !=
      (element_type *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
              (local_118.selection_data.internal.
               super___shared_ptr<duckdb::SelectionData,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
               _M_pi);
    return (idx_t)local_4d0;
  }
  return (idx_t)local_4d0;
}

Assistant:

static idx_t TemplatedDistinctSelectOperation(Vector &left, Vector &right, optional_ptr<const SelectionVector> sel,
                                              idx_t count, optional_ptr<SelectionVector> true_sel,
                                              optional_ptr<SelectionVector> false_sel,
                                              optional_ptr<ValidityMask> null_mask) {

	switch (left.GetType().InternalType()) {
	case PhysicalType::BOOL:
	case PhysicalType::INT8:
		return DistinctSelect<int8_t, int8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INT16:
		return DistinctSelect<int16_t, int16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT32:
		return DistinctSelect<int32_t, int32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::INT64:
		return DistinctSelect<int64_t, int64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT8:
		return DistinctSelect<uint8_t, uint8_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                            null_mask);
	case PhysicalType::UINT16:
		return DistinctSelect<uint16_t, uint16_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT32:
		return DistinctSelect<uint32_t, uint32_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::UINT64:
		return DistinctSelect<uint64_t, uint64_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::INT128:
		return DistinctSelect<hugeint_t, hugeint_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                                null_mask);
	case PhysicalType::UINT128:
		return DistinctSelect<uhugeint_t, uhugeint_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::FLOAT:
		return DistinctSelect<float, float, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                        null_mask);
	case PhysicalType::DOUBLE:
		return DistinctSelect<double, double, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                          null_mask);
	case PhysicalType::INTERVAL:
		return DistinctSelect<interval_t, interval_t, OP>(left, right, sel.get(), count, true_sel.get(),
		                                                  false_sel.get(), null_mask);
	case PhysicalType::VARCHAR:
		return DistinctSelect<string_t, string_t, OP>(left, right, sel.get(), count, true_sel.get(), false_sel.get(),
		                                              null_mask);
	case PhysicalType::STRUCT:
	case PhysicalType::LIST:
	case PhysicalType::ARRAY:
		return DistinctSelectNested<OP>(left, right, sel, count, true_sel, false_sel, null_mask);
	default:
		throw InternalException("Invalid type for distinct selection");
	}
}